

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined4 uVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [60];
  undefined1 auVar53 [60];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  byte bVar76;
  ulong uVar77;
  byte bVar78;
  uint uVar79;
  byte bVar80;
  byte bVar81;
  ulong uVar82;
  uint uVar83;
  long lVar84;
  bool bVar85;
  ulong uVar86;
  uint uVar151;
  uint uVar152;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  uint uVar153;
  uint uVar154;
  uint uVar155;
  uint uVar156;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint uVar157;
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar150 [64];
  float fVar158;
  vint4 bi_2;
  undefined1 auVar167 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  vint4 bi_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  vint4 bi;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  vint4 ai_2;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar235;
  float fVar238;
  float fVar239;
  vint4 ai;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  vint4 ai_1;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar250;
  undefined1 auVar249 [32];
  float fVar251;
  float fVar255;
  float fVar256;
  undefined1 auVar252 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar261;
  float fVar266;
  undefined1 auVar262 [16];
  float fVar264;
  float fVar265;
  undefined1 auVar263 [64];
  float t;
  float fVar267;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar268 [16];
  undefined1 auVar272 [64];
  float s;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [64];
  float s_1;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_be0;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 (*local_ac8) [32];
  Primitive *local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  undefined8 uStack_160;
  float afStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar146 [64];
  undefined1 auVar149 [64];
  
  PVar6 = prim[1];
  uVar82 = (ulong)(byte)PVar6;
  fVar158 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar90 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  auVar213._0_4_ = fVar158 * auVar90._0_4_;
  auVar213._4_4_ = fVar158 * auVar90._4_4_;
  auVar213._8_4_ = fVar158 * auVar90._8_4_;
  auVar213._12_4_ = fVar158 * auVar90._12_4_;
  auVar96._0_4_ = fVar158 * auVar88._0_4_;
  auVar96._4_4_ = fVar158 * auVar88._4_4_;
  auVar96._8_4_ = fVar158 * auVar88._8_4_;
  auVar96._12_4_ = fVar158 * auVar88._12_4_;
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xb + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar82 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar86 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar82 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar276 = ZEXT1664(auVar94);
  uVar77 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar278._4_4_ = auVar96._0_4_;
  auVar278._0_4_ = auVar96._0_4_;
  auVar278._8_4_ = auVar96._0_4_;
  auVar278._12_4_ = auVar96._0_4_;
  auVar268 = vshufps_avx(auVar96,auVar96,0x55);
  auVar89 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar158 = auVar89._0_4_;
  auVar198._0_4_ = fVar158 * auVar91._0_4_;
  fVar261 = auVar89._4_4_;
  auVar198._4_4_ = fVar261 * auVar91._4_4_;
  fVar264 = auVar89._8_4_;
  auVar198._8_4_ = fVar264 * auVar91._8_4_;
  fVar265 = auVar89._12_4_;
  auVar198._12_4_ = fVar265 * auVar91._12_4_;
  auVar178._0_4_ = auVar92._0_4_ * fVar158;
  auVar178._4_4_ = auVar92._4_4_ * fVar261;
  auVar178._8_4_ = auVar92._8_4_ * fVar264;
  auVar178._12_4_ = auVar92._12_4_ * fVar265;
  auVar98._0_4_ = auVar95._0_4_ * fVar158;
  auVar98._4_4_ = auVar95._4_4_ * fVar261;
  auVar98._8_4_ = auVar95._8_4_ * fVar264;
  auVar98._12_4_ = auVar95._12_4_ * fVar265;
  auVar89 = vfmadd231ps_fma(auVar198,auVar268,auVar88);
  auVar87 = vfmadd231ps_fma(auVar178,auVar268,auVar200);
  auVar268 = vfmadd231ps_fma(auVar98,auVar94,auVar268);
  auVar97 = vfmadd231ps_fma(auVar89,auVar278,auVar90);
  auVar87 = vfmadd231ps_fma(auVar87,auVar278,auVar93);
  auVar96 = vfmadd231ps_fma(auVar268,auVar100,auVar278);
  auVar279._4_4_ = auVar213._0_4_;
  auVar279._0_4_ = auVar213._0_4_;
  auVar279._8_4_ = auVar213._0_4_;
  auVar279._12_4_ = auVar213._0_4_;
  auVar268 = vshufps_avx(auVar213,auVar213,0x55);
  auVar89 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar158 = auVar89._0_4_;
  auVar284._0_4_ = fVar158 * auVar91._0_4_;
  fVar261 = auVar89._4_4_;
  auVar284._4_4_ = fVar261 * auVar91._4_4_;
  fVar264 = auVar89._8_4_;
  auVar284._8_4_ = fVar264 * auVar91._8_4_;
  fVar265 = auVar89._12_4_;
  auVar284._12_4_ = fVar265 * auVar91._12_4_;
  auVar225._0_4_ = auVar92._0_4_ * fVar158;
  auVar225._4_4_ = auVar92._4_4_ * fVar261;
  auVar225._8_4_ = auVar92._8_4_ * fVar264;
  auVar225._12_4_ = auVar92._12_4_ * fVar265;
  auVar214._0_4_ = auVar95._0_4_ * fVar158;
  auVar214._4_4_ = auVar95._4_4_ * fVar261;
  auVar214._8_4_ = auVar95._8_4_ * fVar264;
  auVar214._12_4_ = auVar95._12_4_ * fVar265;
  auVar88 = vfmadd231ps_fma(auVar284,auVar268,auVar88);
  auVar91 = vfmadd231ps_fma(auVar225,auVar268,auVar200);
  auVar200 = vfmadd231ps_fma(auVar214,auVar268,auVar94);
  auVar92 = vfmadd231ps_fma(auVar88,auVar279,auVar90);
  auVar94 = vfmadd231ps_fma(auVar91,auVar279,auVar93);
  auVar252._8_4_ = 0x7fffffff;
  auVar252._0_8_ = 0x7fffffff7fffffff;
  auVar252._12_4_ = 0x7fffffff;
  auVar95 = vfmadd231ps_fma(auVar200,auVar279,auVar100);
  auVar90 = vandps_avx(auVar97,auVar252);
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  uVar86 = vcmpps_avx512vl(auVar90,auVar244,1);
  bVar11 = (bool)((byte)uVar86 & 1);
  auVar89._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar97._0_4_;
  bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar97._4_4_;
  bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar97._8_4_;
  bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar97._12_4_;
  auVar90 = vandps_avx(auVar87,auVar252);
  uVar86 = vcmpps_avx512vl(auVar90,auVar244,1);
  bVar11 = (bool)((byte)uVar86 & 1);
  auVar97._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._0_4_;
  bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._4_4_;
  bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._8_4_;
  bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._12_4_;
  auVar90 = vandps_avx(auVar96,auVar252);
  uVar86 = vcmpps_avx512vl(auVar90,auVar244,1);
  bVar11 = (bool)((byte)uVar86 & 1);
  auVar87._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar96._0_4_;
  bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar96._4_4_;
  bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar96._8_4_;
  bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar96._12_4_;
  auVar88 = vrcp14ps_avx512vl(auVar89);
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = &DAT_3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar89,auVar88,auVar245);
  auVar93 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar97);
  auVar90 = vfnmadd213ps_fma(auVar97,auVar88,auVar245);
  auVar200 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vfnmadd213ps_fma(auVar87,auVar88,auVar245);
  auVar100 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar92);
  auVar236._0_4_ = auVar93._0_4_ * auVar90._0_4_;
  auVar236._4_4_ = auVar93._4_4_ * auVar90._4_4_;
  auVar236._8_4_ = auVar93._8_4_ * auVar90._8_4_;
  auVar236._12_4_ = auVar93._12_4_ * auVar90._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar90 = vpmovsxwd_avx(auVar88);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar92);
  auVar89 = vpbroadcastd_avx512vl();
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar88 = vpmovsxwd_avx(auVar91);
  auVar199._0_4_ = auVar93._0_4_ * auVar90._0_4_;
  auVar199._4_4_ = auVar93._4_4_ * auVar90._4_4_;
  auVar199._8_4_ = auVar93._8_4_ * auVar90._8_4_;
  auVar199._12_4_ = auVar93._12_4_ * auVar90._12_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar82 * -2 + 6);
  auVar90 = vpmovsxwd_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar94);
  auVar246._0_4_ = auVar200._0_4_ * auVar90._0_4_;
  auVar246._4_4_ = auVar200._4_4_ * auVar90._4_4_;
  auVar246._8_4_ = auVar200._8_4_ * auVar90._8_4_;
  auVar246._12_4_ = auVar200._12_4_ * auVar90._12_4_;
  auVar90 = vcvtdq2ps_avx(auVar88);
  auVar90 = vsubps_avx(auVar90,auVar94);
  auVar179._0_4_ = auVar200._0_4_ * auVar90._0_4_;
  auVar179._4_4_ = auVar200._4_4_ * auVar90._4_4_;
  auVar179._8_4_ = auVar200._8_4_ * auVar90._8_4_;
  auVar179._12_4_ = auVar200._12_4_ * auVar90._12_4_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar77 + uVar82 + 6);
  auVar90 = vpmovsxwd_avx(auVar200);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar95);
  auVar226._0_4_ = auVar100._0_4_ * auVar90._0_4_;
  auVar226._4_4_ = auVar100._4_4_ * auVar90._4_4_;
  auVar226._8_4_ = auVar100._8_4_ * auVar90._8_4_;
  auVar226._12_4_ = auVar100._12_4_ * auVar90._12_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar82 * 0x17 + 6);
  auVar90 = vpmovsxwd_avx(auVar92);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar95);
  auVar99._0_4_ = auVar100._0_4_ * auVar90._0_4_;
  auVar99._4_4_ = auVar100._4_4_ * auVar90._4_4_;
  auVar99._8_4_ = auVar100._8_4_ * auVar90._8_4_;
  auVar99._12_4_ = auVar100._12_4_ * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar236,auVar199);
  auVar88 = vpminsd_avx(auVar246,auVar179);
  auVar90 = vmaxps_avx(auVar90,auVar88);
  auVar88 = vpminsd_avx(auVar226,auVar99);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar100._4_4_ = uVar5;
  auVar100._0_4_ = uVar5;
  auVar100._8_4_ = uVar5;
  auVar100._12_4_ = uVar5;
  auVar88 = vmaxps_avx512vl(auVar88,auVar100);
  auVar90 = vmaxps_avx(auVar90,auVar88);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  local_7f0 = vmulps_avx512vl(auVar90,auVar94);
  auVar90 = vpmaxsd_avx(auVar236,auVar199);
  auVar88 = vpmaxsd_avx(auVar246,auVar179);
  auVar90 = vminps_avx(auVar90,auVar88);
  auVar88 = vpmaxsd_avx(auVar226,auVar99);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar95._4_4_ = uVar5;
  auVar95._0_4_ = uVar5;
  auVar95._8_4_ = uVar5;
  auVar95._12_4_ = uVar5;
  auVar88 = vminps_avx512vl(auVar88,auVar95);
  auVar90 = vminps_avx(auVar90,auVar88);
  auVar268._8_4_ = 0x3f800003;
  auVar268._0_8_ = 0x3f8000033f800003;
  auVar268._12_4_ = 0x3f800003;
  auVar90 = vmulps_avx512vl(auVar90,auVar268);
  uVar25 = vcmpps_avx512vl(local_7f0,auVar90,2);
  local_aa8 = vpcmpgtd_avx512vl(auVar89,_DAT_01ff0cf0);
  local_aa8 = ((byte)uVar25 & 0xf) & local_aa8;
  if ((char)local_aa8 == '\0') {
    return;
  }
  local_ac8 = (undefined1 (*) [32])local_240;
  auVar177 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar177);
  auVar177 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar272 = ZEXT3264(_DAT_02020f20);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar287 = ZEXT3264(auVar101);
  local_ac0 = prim;
LAB_01b5822f:
  lVar84 = 0;
  for (uVar86 = local_aa8; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
    lVar84 = lVar84 + 1;
  }
  uVar83 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar84 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar83].ptr;
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar7);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar84 = *(long *)&pGVar8[1].time_range.upper;
  auVar90 = *(undefined1 (*) [16])(lVar84 + (long)p_Var9 * uVar86);
  auVar88 = *(undefined1 (*) [16])(lVar84 + (uVar86 + 1) * (long)p_Var9);
  local_aa8 = local_aa8 - 1 & local_aa8;
  if (local_aa8 != 0) {
    uVar82 = local_aa8 - 1 & local_aa8;
    for (uVar77 = local_aa8; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    }
    if (uVar82 != 0) {
      for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar93 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar277._4_4_ = uVar5;
  auVar277._0_4_ = uVar5;
  auVar277._8_4_ = uVar5;
  auVar277._12_4_ = uVar5;
  local_980._16_4_ = uVar5;
  local_980._0_16_ = auVar277;
  local_980._20_4_ = uVar5;
  local_980._24_4_ = uVar5;
  local_980._28_4_ = uVar5;
  auVar101 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar91 = vunpcklps_avx512vl(auVar277,auVar101._0_16_);
  local_aa0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar286 = ZEXT3264(local_aa0);
  auVar100 = local_aa0._0_16_;
  local_a70 = vinsertps_avx512f(auVar91,auVar100,0x28);
  auVar282 = ZEXT1664(local_a70);
  auVar237._0_4_ = auVar90._0_4_ + auVar88._0_4_;
  auVar237._4_4_ = auVar90._4_4_ + auVar88._4_4_;
  auVar237._8_4_ = auVar90._8_4_ + auVar88._8_4_;
  auVar237._12_4_ = auVar90._12_4_ + auVar88._12_4_;
  auVar28._8_4_ = 0x3f000000;
  auVar28._0_8_ = 0x3f0000003f000000;
  auVar28._12_4_ = 0x3f000000;
  auVar91 = vmulps_avx512vl(auVar237,auVar28);
  auVar91 = vsubps_avx(auVar91,auVar93);
  auVar91 = vdpps_avx(auVar91,local_a70,0x7f);
  fVar158 = *(float *)(ray + k * 4 + 0xc0);
  auVar283 = ZEXT464((uint)fVar158);
  local_a80 = vdpps_avx(local_a70,local_a70,0x7f);
  auVar285 = ZEXT1664(local_a80);
  auVar247._4_12_ = ZEXT812(0) << 0x20;
  auVar247._0_4_ = local_a80._0_4_;
  auVar92 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar247);
  auVar200 = vfnmadd213ss_fma(auVar92,local_a80,ZEXT416(0x40000000));
  local_720 = auVar91._0_4_ * auVar92._0_4_ * auVar200._0_4_;
  auVar248._4_4_ = local_720;
  auVar248._0_4_ = local_720;
  auVar248._8_4_ = local_720;
  auVar248._12_4_ = local_720;
  fStack_930 = local_720;
  _local_940 = auVar248;
  fStack_92c = local_720;
  fStack_928 = local_720;
  fStack_924 = local_720;
  auVar91 = vfmadd231ps_fma(auVar93,local_a70,auVar248);
  auVar91 = vblendps_avx(auVar91,ZEXT816(0) << 0x40,8);
  auVar90 = vsubps_avx(auVar90,auVar91);
  auVar93 = vsubps_avx(*(undefined1 (*) [16])(lVar84 + (uVar86 + 2) * (long)p_Var9),auVar91);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar263 = ZEXT1664(auVar88);
  auVar91 = vsubps_avx(*(undefined1 (*) [16])(lVar84 + (uVar86 + 3) * (long)p_Var9),auVar91);
  local_520 = auVar90._0_4_;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  local_a00 = ZEXT1632(auVar90);
  local_540 = vpermps_avx2(auVar102,local_a00);
  auVar104._8_4_ = 2;
  auVar104._0_8_ = 0x200000002;
  auVar104._12_4_ = 2;
  auVar104._16_4_ = 2;
  auVar104._20_4_ = 2;
  auVar104._24_4_ = 2;
  auVar104._28_4_ = 2;
  local_560 = vpermps_avx2(auVar104,local_a00);
  auVar103._8_4_ = 3;
  auVar103._0_8_ = 0x300000003;
  auVar103._12_4_ = 3;
  auVar103._16_4_ = 3;
  auVar103._20_4_ = 3;
  auVar103._24_4_ = 3;
  auVar103._28_4_ = 3;
  local_580 = vpermps_avx2(auVar103,local_a00);
  local_5a0 = auVar88._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  local_a40 = ZEXT1632(auVar88);
  local_5c0 = vpermps_avx2(auVar102,local_a40);
  local_5e0 = vpermps_avx2(auVar104,local_a40);
  local_600 = vpermps_avx2(auVar103,local_a40);
  local_620 = auVar93._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_a20 = ZEXT1632(auVar93);
  local_640 = vpermps_avx2(auVar102,local_a20);
  local_660 = vpermps_avx2(auVar104,local_a20);
  local_680 = vpermps_avx2(auVar103,local_a20);
  local_6a0 = auVar91._0_4_;
  uStack_69c = local_6a0;
  uStack_698 = local_6a0;
  uStack_694 = local_6a0;
  uStack_690 = local_6a0;
  uStack_68c = local_6a0;
  uStack_688 = local_6a0;
  uStack_684 = local_6a0;
  _local_a60 = ZEXT1632(auVar91);
  local_6c0 = vpermps_avx2(auVar102,_local_a60);
  local_6e0 = vpermps_avx2(auVar104,_local_a60);
  _local_7a0 = vpermps_avx2(auVar103,_local_a60);
  auVar90 = vmulss_avx512f(auVar100,auVar100);
  auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar101,auVar101);
  auVar90 = vfmadd231ps_fma(auVar102,local_980,local_980);
  local_700._0_4_ = auVar90._0_4_;
  local_700._4_4_ = local_700._0_4_;
  local_700._8_4_ = local_700._0_4_;
  local_700._12_4_ = local_700._0_4_;
  local_700._16_4_ = local_700._0_4_;
  local_700._20_4_ = local_700._0_4_;
  local_700._24_4_ = local_700._0_4_;
  local_700._28_4_ = local_700._0_4_;
  local_7c0 = vandps_avx(auVar177._0_32_,local_700);
  local_9c0 = ZEXT416((uint)local_720);
  local_720 = fVar158 - local_720;
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  auVar143 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar143);
  local_ab8 = 1;
  local_ab0 = 0;
  auVar143 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar143);
  auVar90 = vsqrtss_avx(local_a80,local_a80);
  auVar88 = vsqrtss_avx(local_a80,local_a80);
  auVar212 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar102 = auVar143._32_32_;
  do {
    auVar200 = auVar212._0_16_;
    auVar91 = vmovshdup_avx(auVar200);
    fVar264 = auVar212._0_4_;
    fVar261 = auVar91._0_4_ - fVar264;
    fVar250 = fVar261 * 0.04761905;
    auVar231._4_4_ = fVar264;
    auVar231._0_4_ = fVar264;
    auVar231._8_4_ = fVar264;
    auVar231._12_4_ = fVar264;
    auVar231._16_4_ = fVar264;
    auVar231._20_4_ = fVar264;
    auVar231._24_4_ = fVar264;
    auVar231._28_4_ = fVar264;
    auVar167._4_4_ = fVar261;
    auVar167._0_4_ = fVar261;
    auVar167._8_4_ = fVar261;
    auVar167._12_4_ = fVar261;
    auVar167._16_4_ = fVar261;
    auVar167._20_4_ = fVar261;
    auVar167._24_4_ = fVar261;
    auVar167._28_4_ = fVar261;
    auVar91 = vfmadd231ps_fma(auVar231,auVar167,auVar272._0_32_);
    auVar103 = vsubps_avx512vl(auVar287._0_32_,ZEXT1632(auVar91));
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar105 = vxorps_avx512vl(ZEXT1632(auVar91),auVar104);
    fVar251 = auVar103._0_4_;
    fVar255 = auVar103._4_4_;
    fVar256 = auVar103._8_4_;
    fVar257 = auVar103._12_4_;
    fVar258 = auVar103._16_4_;
    fVar259 = auVar103._20_4_;
    fVar260 = auVar103._24_4_;
    fVar261 = auVar91._0_4_;
    fVar264 = auVar91._4_4_;
    fVar265 = auVar91._8_4_;
    fVar266 = auVar91._12_4_;
    auVar272._28_36_ = auVar263._28_36_;
    auVar272._0_28_ =
         ZEXT1628(CONCAT412(fVar266 * fVar266,
                            CONCAT48(fVar265 * fVar265,CONCAT44(fVar264 * fVar264,fVar261 * fVar261)
                                    )));
    fVar267 = fVar261 * 3.0;
    fVar269 = fVar264 * 3.0;
    fVar270 = fVar265 * 3.0;
    fVar271 = fVar266 * 3.0;
    auVar287._28_36_ = auVar177._28_36_;
    auVar287._0_28_ = ZEXT1628(CONCAT412(fVar271,CONCAT48(fVar270,CONCAT44(fVar269,fVar267))));
    auVar143._0_4_ = fVar251 * fVar251;
    auVar143._4_4_ = fVar255 * fVar255;
    auVar143._8_4_ = fVar256 * fVar256;
    auVar143._12_4_ = fVar257 * fVar257;
    auVar143._16_4_ = fVar258 * fVar258;
    auVar143._20_4_ = fVar259 * fVar259;
    auVar143._28_36_ = auVar276._28_36_;
    auVar143._24_4_ = fVar260 * fVar260;
    auVar104 = vxorps_avx512vl(auVar103,auVar104);
    auVar276._0_4_ = fVar251 * fVar251 * auVar105._0_4_ * 0.5;
    auVar276._4_4_ = fVar255 * fVar255 * auVar105._4_4_ * 0.5;
    auVar276._8_4_ = fVar256 * fVar256 * auVar105._8_4_ * 0.5;
    auVar276._12_4_ = fVar257 * fVar257 * auVar105._12_4_ * 0.5;
    auVar276._16_4_ = fVar258 * fVar258 * auVar105._16_4_ * 0.5;
    auVar276._20_4_ = fVar259 * fVar259 * auVar105._20_4_ * 0.5;
    auVar276._28_36_ = auVar282._28_36_;
    auVar276._24_4_ = fVar260 * fVar260 * auVar105._24_4_ * 0.5;
    auVar109 = auVar276._0_32_;
    auVar212._0_4_ = (fVar261 * fVar261 * (fVar267 + -5.0) + 2.0) * 0.5;
    auVar212._4_4_ = (fVar264 * fVar264 * (fVar269 + -5.0) + 2.0) * 0.5;
    auVar212._8_4_ = (fVar265 * fVar265 * (fVar270 + -5.0) + 2.0) * 0.5;
    auVar212._12_4_ = (fVar266 * fVar266 * (fVar271 + -5.0) + 2.0) * 0.5;
    auVar212._16_4_ = 0x3f800000;
    auVar212._20_4_ = 0x3f800000;
    auVar212._28_36_ = auVar283._28_36_;
    auVar212._24_4_ = 0x3f800000;
    auVar116 = auVar212._0_32_;
    auVar263._0_4_ = (auVar143._0_4_ * (fVar251 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._4_4_ = (auVar143._4_4_ * (fVar255 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._8_4_ = (auVar143._8_4_ * (fVar256 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._12_4_ = (auVar143._12_4_ * (fVar257 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._16_4_ = (auVar143._16_4_ * (fVar258 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._20_4_ = (auVar143._20_4_ * (fVar259 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._28_36_ = auVar285._28_36_;
    auVar263._24_4_ = (auVar143._24_4_ * (fVar260 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar117 = auVar263._0_32_;
    fVar235 = fVar261 * fVar261 * auVar104._0_4_ * 0.5;
    fVar238 = fVar264 * fVar264 * auVar104._4_4_ * 0.5;
    auVar107._4_4_ = fVar238;
    auVar107._0_4_ = fVar235;
    fVar239 = fVar265 * fVar265 * auVar104._8_4_ * 0.5;
    auVar107._8_4_ = fVar239;
    fVar240 = fVar266 * fVar266 * auVar104._12_4_ * 0.5;
    auVar107._12_4_ = fVar240;
    fVar241 = auVar104._16_4_ * 0.0 * 0.0 * 0.5;
    auVar107._16_4_ = fVar241;
    fVar242 = auVar104._20_4_ * 0.0 * 0.0 * 0.5;
    auVar107._20_4_ = fVar242;
    fVar243 = auVar104._24_4_ * 0.0 * 0.0 * 0.5;
    auVar107._24_4_ = fVar243;
    auVar107._28_4_ = auVar104._28_4_;
    auVar72._4_4_ = uStack_69c;
    auVar72._0_4_ = local_6a0;
    auVar72._8_4_ = uStack_698;
    auVar72._12_4_ = uStack_694;
    auVar126._16_4_ = uStack_690;
    auVar126._0_16_ = auVar72;
    auVar126._20_4_ = uStack_68c;
    auVar126._24_4_ = uStack_688;
    auVar126._28_4_ = uStack_684;
    auVar105 = vmulps_avx512vl(auVar126,auVar107);
    auVar106 = vmulps_avx512vl(local_6c0,auVar107);
    auVar107 = vmulps_avx512vl(local_6e0,auVar107);
    auVar108._4_4_ = fVar238 * (float)local_7a0._4_4_;
    auVar108._0_4_ = fVar235 * (float)local_7a0._0_4_;
    auVar108._8_4_ = fVar239 * fStack_798;
    auVar108._12_4_ = fVar240 * fStack_794;
    auVar108._16_4_ = fVar241 * fStack_790;
    auVar108._20_4_ = fVar242 * fStack_78c;
    auVar108._24_4_ = fVar243 * fStack_788;
    auVar108._28_4_ = auVar104._28_4_;
    auVar132._4_4_ = uStack_61c;
    auVar132._0_4_ = local_620;
    auVar132._8_4_ = uStack_618;
    auVar132._12_4_ = uStack_614;
    auVar132._16_4_ = uStack_610;
    auVar132._20_4_ = uStack_60c;
    auVar132._24_4_ = uStack_608;
    auVar132._28_4_ = uStack_604;
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar117,auVar132);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar117,local_640);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar117,local_660);
    auVar106 = vfmadd231ps_avx512vl(auVar108,local_680,auVar117);
    auVar133._4_4_ = uStack_59c;
    auVar133._0_4_ = local_5a0;
    auVar133._8_4_ = uStack_598;
    auVar133._12_4_ = uStack_594;
    auVar133._16_4_ = uStack_590;
    auVar133._20_4_ = uStack_58c;
    auVar133._24_4_ = uStack_588;
    auVar133._28_4_ = uStack_584;
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar133);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar116,local_5c0);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,local_5e0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_600,auVar116);
    auVar73._4_4_ = fStack_51c;
    auVar73._0_4_ = local_520;
    auVar73._8_4_ = fStack_518;
    auVar73._12_4_ = fStack_514;
    auVar73._16_4_ = fStack_510;
    auVar73._20_4_ = fStack_50c;
    auVar73._24_4_ = fStack_508;
    auVar73._28_4_ = fStack_504;
    auVar91 = vfmadd231ps_fma(auVar104,auVar109,auVar73);
    local_b00 = vfmadd231ps_avx512vl(auVar105,auVar109,local_540);
    auVar108 = vfmadd231ps_avx512vl(auVar107,auVar109,local_560);
    auVar107 = vfmadd231ps_avx512vl(auVar106,local_580,auVar109);
    auVar110._4_4_ = (fVar255 + fVar255) * fVar264;
    auVar110._0_4_ = (fVar251 + fVar251) * fVar261;
    auVar110._8_4_ = (fVar256 + fVar256) * fVar265;
    auVar110._12_4_ = (fVar257 + fVar257) * fVar266;
    auVar110._16_4_ = (fVar258 + fVar258) * 0.0;
    auVar110._20_4_ = (fVar259 + fVar259) * 0.0;
    auVar110._24_4_ = (fVar260 + fVar260) * 0.0;
    auVar110._28_4_ = auVar283._28_4_;
    auVar104 = vsubps_avx(auVar110,auVar143._0_32_);
    auVar105._8_4_ = 0x40000000;
    auVar105._0_8_ = 0x4000000040000000;
    auVar105._12_4_ = 0x40000000;
    auVar105._16_4_ = 0x40000000;
    auVar105._20_4_ = 0x40000000;
    auVar105._24_4_ = 0x40000000;
    auVar105._28_4_ = 0x40000000;
    auVar106 = vaddps_avx512vl(auVar287._0_32_,auVar105);
    auVar111._4_4_ = (fVar255 + fVar255) * auVar106._4_4_;
    auVar111._0_4_ = (fVar251 + fVar251) * auVar106._0_4_;
    auVar111._8_4_ = (fVar256 + fVar256) * auVar106._8_4_;
    auVar111._12_4_ = (fVar257 + fVar257) * auVar106._12_4_;
    auVar111._16_4_ = (fVar258 + fVar258) * auVar106._16_4_;
    auVar111._20_4_ = (fVar259 + fVar259) * auVar106._20_4_;
    auVar111._24_4_ = (fVar260 + fVar260) * auVar106._24_4_;
    auVar111._28_4_ = auVar106._28_4_;
    auVar112._4_4_ = fVar255 * 3.0 * fVar255;
    auVar112._0_4_ = fVar251 * 3.0 * fVar251;
    auVar112._8_4_ = fVar256 * 3.0 * fVar256;
    auVar112._12_4_ = fVar257 * 3.0 * fVar257;
    auVar112._16_4_ = fVar258 * 3.0 * fVar258;
    auVar112._20_4_ = fVar259 * 3.0 * fVar259;
    auVar112._24_4_ = fVar260 * 3.0 * fVar260;
    auVar112._28_4_ = auVar103._28_4_;
    auVar103 = vsubps_avx(auVar111,auVar112);
    auVar105 = vsubps_avx(auVar272._0_32_,auVar110);
    auVar113._4_4_ = auVar104._4_4_ * 0.5;
    auVar113._0_4_ = auVar104._0_4_ * 0.5;
    auVar113._8_4_ = auVar104._8_4_ * 0.5;
    auVar113._12_4_ = auVar104._12_4_ * 0.5;
    auVar113._16_4_ = auVar104._16_4_ * 0.5;
    auVar113._20_4_ = auVar104._20_4_ * 0.5;
    auVar113._24_4_ = auVar104._24_4_ * 0.5;
    auVar113._28_4_ = auVar106._28_4_;
    auVar114._28_4_ = auVar177._28_4_ + -5.0 + 0.0;
    auVar114._0_28_ =
         ZEXT1628(CONCAT412(((fVar266 + fVar266) * (fVar271 + -5.0) + fVar271 * fVar266) * 0.5,
                            CONCAT48(((fVar265 + fVar265) * (fVar270 + -5.0) + fVar270 * fVar265) *
                                     0.5,CONCAT44(((fVar264 + fVar264) * (fVar269 + -5.0) +
                                                  fVar269 * fVar264) * 0.5,
                                                  ((fVar261 + fVar261) * (fVar267 + -5.0) +
                                                  fVar267 * fVar261) * 0.5))));
    auVar115._4_4_ = auVar103._4_4_ * 0.5;
    auVar115._0_4_ = auVar103._0_4_ * 0.5;
    auVar115._8_4_ = auVar103._8_4_ * 0.5;
    auVar115._12_4_ = auVar103._12_4_ * 0.5;
    auVar115._16_4_ = auVar103._16_4_ * 0.5;
    auVar115._20_4_ = auVar103._20_4_ * 0.5;
    auVar115._24_4_ = auVar103._24_4_ * 0.5;
    auVar115._28_4_ = auVar103._28_4_;
    fVar261 = auVar105._0_4_ * 0.5;
    fVar264 = auVar105._4_4_ * 0.5;
    auVar120._4_4_ = fVar264;
    auVar120._0_4_ = fVar261;
    fVar265 = auVar105._8_4_ * 0.5;
    auVar120._8_4_ = fVar265;
    fVar266 = auVar105._12_4_ * 0.5;
    auVar120._12_4_ = fVar266;
    fVar235 = auVar105._16_4_ * 0.5;
    auVar120._16_4_ = fVar235;
    fVar238 = auVar105._20_4_ * 0.5;
    auVar120._20_4_ = fVar238;
    fVar239 = auVar105._24_4_ * 0.5;
    auVar120._24_4_ = fVar239;
    auVar120._28_4_ = auVar105._28_4_;
    auVar103 = vmulps_avx512vl(auVar126,auVar120);
    auVar106 = vmulps_avx512vl(local_6c0,auVar120);
    auVar109 = vmulps_avx512vl(local_6e0,auVar120);
    auVar121._4_4_ = fVar264 * (float)local_7a0._4_4_;
    auVar121._0_4_ = fVar261 * (float)local_7a0._0_4_;
    auVar121._8_4_ = fVar265 * fStack_798;
    auVar121._12_4_ = fVar266 * fStack_794;
    auVar121._16_4_ = fVar235 * fStack_790;
    auVar121._20_4_ = fVar238 * fStack_78c;
    auVar121._24_4_ = fVar239 * fStack_788;
    auVar121._28_4_ = auVar105._28_4_;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,auVar132);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar115,local_640);
    auVar106 = vfmadd231ps_avx512vl(auVar109,auVar115,local_660);
    auVar109 = vfmadd231ps_avx512vl(auVar121,local_680,auVar115);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar114,auVar133);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_5c0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_5e0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_600,auVar114);
    auVar93 = vfmadd231ps_fma(auVar103,auVar113,auVar73);
    auVar103 = vfmadd231ps_avx512vl(auVar105,auVar113,local_540);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar113,local_560);
    auVar106 = vfmadd231ps_avx512vl(auVar109,local_580,auVar113);
    auVar129._4_4_ = auVar93._4_4_ * fVar250;
    auVar129._0_4_ = auVar93._0_4_ * fVar250;
    auVar129._8_4_ = auVar93._8_4_ * fVar250;
    auVar129._12_4_ = auVar93._12_4_ * fVar250;
    auVar129._16_4_ = fVar250 * 0.0;
    auVar129._20_4_ = fVar250 * 0.0;
    auVar129._24_4_ = fVar250 * 0.0;
    auVar129._28_4_ = auVar104._28_4_;
    auVar276 = ZEXT3264(auVar129);
    auVar130._4_4_ = auVar103._4_4_ * fVar250;
    auVar130._0_4_ = auVar103._0_4_ * fVar250;
    auVar130._8_4_ = auVar103._8_4_ * fVar250;
    auVar130._12_4_ = auVar103._12_4_ * fVar250;
    auVar130._16_4_ = auVar103._16_4_ * fVar250;
    auVar130._20_4_ = auVar103._20_4_ * fVar250;
    auVar130._24_4_ = auVar103._24_4_ * fVar250;
    auVar130._28_4_ = auVar103._28_4_;
    auVar131._4_4_ = auVar105._4_4_ * fVar250;
    auVar131._0_4_ = auVar105._0_4_ * fVar250;
    auVar131._8_4_ = auVar105._8_4_ * fVar250;
    auVar131._12_4_ = auVar105._12_4_ * fVar250;
    auVar131._16_4_ = auVar105._16_4_ * fVar250;
    auVar131._20_4_ = auVar105._20_4_ * fVar250;
    auVar131._24_4_ = auVar105._24_4_ * fVar250;
    auVar131._28_4_ = auVar105._28_4_;
    auVar282 = ZEXT3264(auVar131);
    fVar261 = auVar106._0_4_ * fVar250;
    fVar264 = auVar106._4_4_ * fVar250;
    auVar122._4_4_ = fVar264;
    auVar122._0_4_ = fVar261;
    fVar265 = auVar106._8_4_ * fVar250;
    auVar122._8_4_ = fVar265;
    fVar266 = auVar106._12_4_ * fVar250;
    auVar122._12_4_ = fVar266;
    fVar235 = auVar106._16_4_ * fVar250;
    auVar122._16_4_ = fVar235;
    fVar238 = auVar106._20_4_ * fVar250;
    auVar122._20_4_ = fVar238;
    fVar250 = auVar106._24_4_ * fVar250;
    auVar122._24_4_ = fVar250;
    auVar122._28_4_ = fStack_504;
    auVar93 = vxorps_avx512vl(auVar72,auVar72);
    auVar110 = vpermt2ps_avx512vl(ZEXT1632(auVar91),_DAT_0205fd20,ZEXT1632(auVar93));
    auVar263 = ZEXT3264(auVar110);
    auVar111 = vpermt2ps_avx512vl(local_b00,_DAT_0205fd20,ZEXT1632(auVar93));
    auVar105 = ZEXT1632(auVar93);
    auVar112 = vpermt2ps_avx512vl(auVar108,_DAT_0205fd20,auVar105);
    auVar232._0_4_ = auVar107._0_4_ + fVar261;
    auVar232._4_4_ = auVar107._4_4_ + fVar264;
    auVar232._8_4_ = auVar107._8_4_ + fVar265;
    auVar232._12_4_ = auVar107._12_4_ + fVar266;
    auVar232._16_4_ = auVar107._16_4_ + fVar235;
    auVar232._20_4_ = auVar107._20_4_ + fVar238;
    auVar232._24_4_ = auVar107._24_4_ + fVar250;
    auVar232._28_4_ = auVar107._28_4_ + fStack_504;
    auVar104 = vmaxps_avx(auVar107,auVar232);
    auVar103 = vminps_avx(auVar107,auVar232);
    auVar109 = vpermt2ps_avx512vl(auVar107,_DAT_0205fd20,auVar105);
    auVar113 = vpermt2ps_avx512vl(auVar129,_DAT_0205fd20,auVar105);
    auVar114 = vpermt2ps_avx512vl(auVar130,_DAT_0205fd20,auVar105);
    auVar126 = ZEXT1632(auVar93);
    auVar115 = vpermt2ps_avx512vl(auVar131,_DAT_0205fd20,auVar126);
    auVar105 = vpermt2ps_avx512vl(auVar122,_DAT_0205fd20,auVar126);
    auVar116 = vsubps_avx512vl(auVar109,auVar105);
    auVar105 = vsubps_avx(auVar110,ZEXT1632(auVar91));
    auVar107 = vsubps_avx(auVar111,local_b00);
    local_900 = vsubps_avx512vl(auVar112,auVar108);
    auVar106 = vmulps_avx512vl(auVar107,auVar131);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar130,local_900);
    auVar117 = vmulps_avx512vl(local_900,auVar129);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar131,auVar105);
    auVar118 = vmulps_avx512vl(auVar105,auVar130);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar129,auVar107);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar106,auVar106);
    auVar106 = vmulps_avx512vl(local_900,local_900);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar107,auVar107);
    auVar118 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar119 = vrcp14ps_avx512vl(auVar118);
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = &DAT_3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar106._16_4_ = 0x3f800000;
    auVar106._20_4_ = 0x3f800000;
    auVar106._24_4_ = 0x3f800000;
    auVar106._28_4_ = 0x3f800000;
    auVar106 = vfnmadd213ps_avx512vl(auVar119,auVar118,auVar106);
    auVar106 = vfmadd132ps_avx512vl(auVar106,auVar119,auVar119);
    auVar117 = vmulps_avx512vl(auVar117,auVar106);
    auVar119 = vmulps_avx512vl(auVar107,auVar115);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar114,local_900);
    auVar120 = vmulps_avx512vl(local_900,auVar113);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar115,auVar105);
    auVar121 = vmulps_avx512vl(auVar105,auVar114);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar113,auVar107);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar106 = vmulps_avx512vl(auVar119,auVar106);
    auVar106 = vmaxps_avx512vl(auVar117,auVar106);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar117 = vmaxps_avx512vl(auVar116,auVar109);
    auVar104 = vmaxps_avx512vl(auVar104,auVar117);
    auVar117 = vaddps_avx512vl(auVar106,auVar104);
    auVar104 = vminps_avx512vl(auVar116,auVar109);
    auVar104 = vminps_avx(auVar103,auVar104);
    auVar104 = vsubps_avx512vl(auVar104,auVar106);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar117,auVar109);
    auVar116._8_4_ = 0x3f7ffffc;
    auVar116._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar116._12_4_ = 0x3f7ffffc;
    auVar116._16_4_ = 0x3f7ffffc;
    auVar116._20_4_ = 0x3f7ffffc;
    auVar116._24_4_ = 0x3f7ffffc;
    auVar116._28_4_ = 0x3f7ffffc;
    auVar106 = vmulps_avx512vl(auVar104,auVar116);
    auVar123._4_4_ = auVar103._4_4_ * auVar103._4_4_;
    auVar123._0_4_ = auVar103._0_4_ * auVar103._0_4_;
    auVar123._8_4_ = auVar103._8_4_ * auVar103._8_4_;
    auVar123._12_4_ = auVar103._12_4_ * auVar103._12_4_;
    auVar123._16_4_ = auVar103._16_4_ * auVar103._16_4_;
    auVar123._20_4_ = auVar103._20_4_ * auVar103._20_4_;
    auVar123._24_4_ = auVar103._24_4_ * auVar103._24_4_;
    auVar123._28_4_ = auVar106._28_4_;
    auVar104 = vrsqrt14ps_avx512vl(auVar118);
    auVar117._8_4_ = 0xbf000000;
    auVar117._0_8_ = 0xbf000000bf000000;
    auVar117._12_4_ = 0xbf000000;
    auVar117._16_4_ = 0xbf000000;
    auVar117._20_4_ = 0xbf000000;
    auVar117._24_4_ = 0xbf000000;
    auVar117._28_4_ = 0xbf000000;
    auVar103 = vmulps_avx512vl(auVar118,auVar117);
    auVar124._4_4_ = auVar104._4_4_ * auVar103._4_4_;
    auVar124._0_4_ = auVar104._0_4_ * auVar103._0_4_;
    auVar124._8_4_ = auVar104._8_4_ * auVar103._8_4_;
    auVar124._12_4_ = auVar104._12_4_ * auVar103._12_4_;
    auVar124._16_4_ = auVar104._16_4_ * auVar103._16_4_;
    auVar124._20_4_ = auVar104._20_4_ * auVar103._20_4_;
    auVar124._24_4_ = auVar104._24_4_ * auVar103._24_4_;
    auVar124._28_4_ = auVar103._28_4_;
    auVar103 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar103,auVar124);
    auVar118._8_4_ = 0x3fc00000;
    auVar118._0_8_ = 0x3fc000003fc00000;
    auVar118._12_4_ = 0x3fc00000;
    auVar118._16_4_ = 0x3fc00000;
    auVar118._20_4_ = 0x3fc00000;
    auVar118._24_4_ = 0x3fc00000;
    auVar118._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar104,auVar118);
    auVar283 = ZEXT3264(auVar103);
    auVar125._4_4_ = auVar103._4_4_ * auVar105._4_4_;
    auVar125._0_4_ = auVar103._0_4_ * auVar105._0_4_;
    auVar125._8_4_ = auVar103._8_4_ * auVar105._8_4_;
    auVar125._12_4_ = auVar103._12_4_ * auVar105._12_4_;
    auVar125._16_4_ = auVar103._16_4_ * auVar105._16_4_;
    auVar125._20_4_ = auVar103._20_4_ * auVar105._20_4_;
    auVar125._24_4_ = auVar103._24_4_ * auVar105._24_4_;
    auVar125._28_4_ = auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar107,auVar103);
    auVar109 = vmulps_avx512vl(local_900,auVar103);
    local_8e0 = ZEXT1632(auVar91);
    auVar116 = vsubps_avx512vl(auVar126,local_8e0);
    auVar117 = vsubps_avx512vl(auVar126,local_b00);
    auVar118 = vsubps_avx512vl(auVar126,auVar108);
    auVar119 = vmulps_avx512vl(auVar286._0_32_,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar101,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_980,auVar116);
    auVar120 = vmulps_avx512vl(auVar118,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar117);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar116);
    auVar121 = vmulps_avx512vl(auVar286._0_32_,auVar109);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar104,auVar101);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar125,local_980);
    auVar109 = vmulps_avx512vl(auVar118,auVar109);
    auVar104 = vfmadd231ps_avx512vl(auVar109,auVar117,auVar104);
    auVar109 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar125);
    local_920 = vmulps_avx512vl(auVar121,auVar121);
    auVar104 = vsubps_avx(local_700,local_920);
    auVar285 = ZEXT3264(auVar104);
    auVar122 = vmulps_avx512vl(auVar121,auVar109);
    auVar119 = vsubps_avx512vl(auVar119,auVar122);
    auVar122 = vaddps_avx512vl(auVar119,auVar119);
    auVar119 = vmulps_avx512vl(auVar109,auVar109);
    local_b20 = vsubps_avx512vl(auVar120,auVar119);
    auVar120 = vsubps_avx512vl(local_b20,auVar123);
    auVar123 = vmulps_avx512vl(auVar122,auVar122);
    auVar119._8_4_ = 0x40800000;
    auVar119._0_8_ = 0x4080000040800000;
    auVar119._12_4_ = 0x40800000;
    auVar119._16_4_ = 0x40800000;
    auVar119._20_4_ = 0x40800000;
    auVar119._24_4_ = 0x40800000;
    auVar119._28_4_ = 0x40800000;
    auVar119 = vmulps_avx512vl(auVar104,auVar119);
    auVar124 = vmulps_avx512vl(auVar119,auVar120);
    auVar124 = vsubps_avx512vl(auVar123,auVar124);
    uVar86 = vcmpps_avx512vl(auVar124,auVar126,5);
    bVar74 = (byte)uVar86;
    if (bVar74 == 0) {
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar124 = vsqrtps_avx512vl(auVar124);
      auVar125 = vaddps_avx512vl(auVar104,auVar104);
      auVar126 = vrcp14ps_avx512vl(auVar125);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = &DAT_3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar34._16_4_ = 0x3f800000;
      auVar34._20_4_ = 0x3f800000;
      auVar34._24_4_ = 0x3f800000;
      auVar34._28_4_ = 0x3f800000;
      auVar125 = vfnmadd213ps_avx512vl(auVar125,auVar126,auVar34);
      auVar125 = vfmadd132ps_avx512vl(auVar125,auVar126,auVar126);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar126 = vxorps_avx512vl(auVar122,auVar35);
      auVar126 = vsubps_avx512vl(auVar126,auVar124);
      auVar126 = vmulps_avx512vl(auVar126,auVar125);
      auVar124 = vsubps_avx512vl(auVar124,auVar122);
      auVar124 = vmulps_avx512vl(auVar124,auVar125);
      auVar125 = vfmadd213ps_avx512vl(auVar121,auVar126,auVar109);
      local_820 = vmulps_avx512vl(auVar103,auVar125);
      auVar125 = vfmadd213ps_avx512vl(auVar121,auVar124,auVar109);
      local_840 = vmulps_avx512vl(auVar103,auVar125);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar125 = vblendmps_avx512vl(auVar125,auVar126);
      auVar127._0_4_ =
           (uint)(bVar74 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar74 & 1) * local_840._0_4_;
      bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * local_840._4_4_;
      bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * local_840._8_4_;
      bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * local_840._12_4_;
      bVar11 = (bool)((byte)(uVar86 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar11 * auVar125._16_4_ | (uint)!bVar11 * local_840._16_4_;
      bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar11 * auVar125._20_4_ | (uint)!bVar11 * local_840._20_4_;
      bVar11 = (bool)((byte)(uVar86 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar11 * auVar125._24_4_ | (uint)!bVar11 * local_840._24_4_;
      bVar11 = SUB81(uVar86 >> 7,0);
      auVar127._28_4_ = (uint)bVar11 * auVar125._28_4_ | (uint)!bVar11 * local_840._28_4_;
      auVar221._8_4_ = 0xff800000;
      auVar221._0_8_ = 0xff800000ff800000;
      auVar221._12_4_ = 0xff800000;
      auVar221._16_4_ = 0xff800000;
      auVar221._20_4_ = 0xff800000;
      auVar221._24_4_ = 0xff800000;
      auVar221._28_4_ = 0xff800000;
      auVar125 = vblendmps_avx512vl(auVar221,auVar124);
      auVar128._0_4_ =
           (uint)(bVar74 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar124._0_4_;
      bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar124._4_4_;
      bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar124._8_4_;
      bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar124._12_4_;
      bVar11 = (bool)((byte)(uVar86 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar11 * auVar125._16_4_ | (uint)!bVar11 * auVar124._16_4_;
      bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar11 * auVar125._20_4_ | (uint)!bVar11 * auVar124._20_4_;
      bVar11 = (bool)((byte)(uVar86 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar11 * auVar125._24_4_ | (uint)!bVar11 * auVar124._24_4_;
      bVar11 = SUB81(uVar86 >> 7,0);
      auVar128._28_4_ = (uint)bVar11 * auVar125._28_4_ | (uint)!bVar11 * auVar124._28_4_;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_920,auVar125);
      auVar124 = vmaxps_avx(local_7c0,auVar125);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      auVar124 = vmulps_avx512vl(auVar124,auVar36);
      vandps_avx512vl(auVar104,auVar125);
      uVar77 = vcmpps_avx512vl(auVar124,auVar124,1);
      uVar86 = uVar86 & uVar77;
      bVar81 = (byte)uVar86;
      if (bVar81 != 0) {
        uVar77 = vcmpps_avx512vl(auVar120,_DAT_02020f00,2);
        auVar234._8_4_ = 0xff800000;
        auVar234._0_8_ = 0xff800000ff800000;
        auVar234._12_4_ = 0xff800000;
        auVar234._16_4_ = 0xff800000;
        auVar234._20_4_ = 0xff800000;
        auVar234._24_4_ = 0xff800000;
        auVar234._28_4_ = 0xff800000;
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar125 = vblendmps_avx512vl(auVar120,auVar234);
        bVar78 = (byte)uVar77;
        uVar79 = (uint)(bVar78 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar124._0_4_;
        bVar11 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar151 = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar124._4_4_;
        bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar152 = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar124._8_4_;
        bVar11 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar153 = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar124._12_4_;
        bVar11 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar154 = (uint)bVar11 * auVar125._16_4_ | (uint)!bVar11 * auVar124._16_4_;
        bVar11 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar155 = (uint)bVar11 * auVar125._20_4_ | (uint)!bVar11 * auVar124._20_4_;
        bVar11 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar156 = (uint)bVar11 * auVar125._24_4_ | (uint)!bVar11 * auVar124._24_4_;
        bVar11 = SUB81(uVar77 >> 7,0);
        uVar157 = (uint)bVar11 * auVar125._28_4_ | (uint)!bVar11 * auVar124._28_4_;
        auVar127._0_4_ = (bVar81 & 1) * uVar79 | !(bool)(bVar81 & 1) * auVar127._0_4_;
        bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar127._4_4_ = bVar11 * uVar151 | !bVar11 * auVar127._4_4_;
        bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar127._8_4_ = bVar11 * uVar152 | !bVar11 * auVar127._8_4_;
        bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar127._12_4_ = bVar11 * uVar153 | !bVar11 * auVar127._12_4_;
        bVar11 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar127._16_4_ = bVar11 * uVar154 | !bVar11 * auVar127._16_4_;
        bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar127._20_4_ = bVar11 * uVar155 | !bVar11 * auVar127._20_4_;
        bVar11 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar127._24_4_ = bVar11 * uVar156 | !bVar11 * auVar127._24_4_;
        bVar11 = SUB81(uVar86 >> 7,0);
        auVar127._28_4_ = bVar11 * uVar157 | !bVar11 * auVar127._28_4_;
        auVar120 = vblendmps_avx512vl(auVar234,auVar120);
        bVar11 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar17 = SUB81(uVar77 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar81 & 1) *
             ((uint)(bVar78 & 1) * auVar120._0_4_ | !(bool)(bVar78 & 1) * uVar79) |
             !(bool)(bVar81 & 1) * auVar128._0_4_;
        bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar85 * ((uint)bVar11 * auVar120._4_4_ | !bVar11 * uVar151) |
             !bVar85 * auVar128._4_4_;
        bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar11 * ((uint)bVar12 * auVar120._8_4_ | !bVar12 * uVar152) |
             !bVar11 * auVar128._8_4_;
        bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar120._12_4_ | !bVar13 * uVar153) |
             !bVar11 * auVar128._12_4_;
        bVar11 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar120._16_4_ | !bVar14 * uVar154) |
             !bVar11 * auVar128._16_4_;
        bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar120._20_4_ | !bVar15 * uVar155) |
             !bVar11 * auVar128._20_4_;
        bVar11 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar120._24_4_ | !bVar16 * uVar156) |
             !bVar11 * auVar128._24_4_;
        bVar11 = SUB81(uVar86 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar120._28_4_ | !bVar17 * uVar157) |
             !bVar11 * auVar128._28_4_;
        bVar74 = (~bVar81 | bVar78) & bVar74;
      }
    }
    if ((bVar74 & 0x7f) == 0) {
      auVar177 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar272 = ZEXT3264(_DAT_02020f20);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar287 = ZEXT3264(auVar104);
      auVar286 = ZEXT3264(local_aa0);
    }
    else {
      fVar261 = *(float *)(ray + k * 4 + 0x200) - (float)local_9c0._0_4_;
      auVar222._4_4_ = fVar261;
      auVar222._0_4_ = fVar261;
      auVar222._8_4_ = fVar261;
      auVar222._12_4_ = fVar261;
      auVar222._16_4_ = fVar261;
      auVar222._20_4_ = fVar261;
      auVar222._24_4_ = fVar261;
      auVar222._28_4_ = fVar261;
      auVar120 = vminps_avx512vl(auVar222,auVar128);
      auVar71._4_4_ = fStack_71c;
      auVar71._0_4_ = local_720;
      auVar71._8_4_ = fStack_718;
      auVar71._12_4_ = fStack_714;
      auVar71._16_4_ = fStack_710;
      auVar71._20_4_ = fStack_70c;
      auVar71._24_4_ = fStack_708;
      auVar71._28_4_ = fStack_704;
      auVar124 = vmaxps_avx512vl(auVar71,auVar127);
      auVar118 = vmulps_avx512vl(auVar118,auVar131);
      auVar117 = vfmadd213ps_avx512vl(auVar117,auVar130,auVar118);
      auVar116 = vfmadd213ps_avx512vl(auVar116,auVar129,auVar117);
      auVar286 = ZEXT3264(local_aa0);
      auVar117 = vmulps_avx512vl(local_aa0,auVar131);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar101,auVar130);
      auVar117 = vfmadd231ps_avx512vl(auVar117,local_980,auVar129);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar117,auVar118);
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar25 = vcmpps_avx512vl(auVar118,auVar129,1);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar116 = vxorps_avx512vl(auVar116,auVar130);
      auVar131 = vrcp14ps_avx512vl(auVar117);
      auVar125 = vxorps_avx512vl(auVar117,auVar130);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar287 = ZEXT3264(auVar126);
      auVar132 = vfnmadd213ps_avx512vl(auVar131,auVar117,auVar126);
      auVar132 = vfmadd132ps_avx512vl(auVar132,auVar131,auVar131);
      auVar132 = vmulps_avx512vl(auVar132,auVar116);
      uVar26 = vcmpps_avx512vl(auVar117,auVar125,1);
      bVar81 = (byte)uVar25 | (byte)uVar26;
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar132,auVar133);
      auVar134._0_4_ =
           (uint)(bVar81 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar131._0_4_;
      bVar11 = (bool)(bVar81 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * auVar131._4_4_;
      bVar11 = (bool)(bVar81 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * auVar131._8_4_;
      bVar11 = (bool)(bVar81 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * auVar131._12_4_;
      bVar11 = (bool)(bVar81 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * auVar131._16_4_;
      bVar11 = (bool)(bVar81 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * auVar131._20_4_;
      bVar11 = (bool)(bVar81 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * auVar131._24_4_;
      auVar134._28_4_ =
           (uint)(bVar81 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar81 >> 7) * auVar131._28_4_;
      auVar116 = vmaxps_avx(auVar124,auVar134);
      uVar26 = vcmpps_avx512vl(auVar117,auVar125,6);
      bVar81 = (byte)uVar25 | (byte)uVar26;
      auVar282 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar135._0_4_ = (uint)(bVar81 & 1) * 0x7f800000 | (uint)!(bool)(bVar81 & 1) * auVar132._0_4_;
      bVar11 = (bool)(bVar81 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar132._4_4_;
      bVar11 = (bool)(bVar81 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar132._8_4_;
      bVar11 = (bool)(bVar81 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar132._12_4_;
      bVar11 = (bool)(bVar81 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar132._16_4_;
      bVar11 = (bool)(bVar81 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar132._20_4_;
      bVar11 = (bool)(bVar81 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar132._24_4_;
      auVar135._28_4_ =
           (uint)(bVar81 >> 7) * 0x7f800000 | (uint)!(bool)(bVar81 >> 7) * auVar132._28_4_;
      auVar117 = vminps_avx(auVar120,auVar135);
      auVar93 = vxorps_avx512vl(auVar125._0_16_,auVar125._0_16_);
      auVar110 = vsubps_avx512vl(ZEXT1632(auVar93),auVar110);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar93),auVar111);
      auVar120 = ZEXT1632(auVar93);
      auVar112 = vsubps_avx512vl(auVar120,auVar112);
      auVar45._4_4_ = auVar112._4_4_ * auVar115._4_4_;
      auVar45._0_4_ = auVar112._0_4_ * auVar115._0_4_;
      auVar45._8_4_ = auVar112._8_4_ * auVar115._8_4_;
      auVar45._12_4_ = auVar112._12_4_ * auVar115._12_4_;
      auVar45._16_4_ = auVar112._16_4_ * auVar115._16_4_;
      auVar45._20_4_ = auVar112._20_4_ * auVar115._20_4_;
      auVar45._24_4_ = auVar112._24_4_ * auVar115._24_4_;
      auVar45._28_4_ = auVar112._28_4_;
      auVar111 = vfnmsub231ps_avx512vl(auVar45,auVar114,auVar111);
      auVar110 = vfnmadd231ps_avx512vl(auVar111,auVar113,auVar110);
      auVar111 = vmulps_avx512vl(local_aa0,auVar115);
      auVar111 = vfnmsub231ps_avx512vl(auVar111,auVar101,auVar114);
      auVar111 = vfnmadd231ps_avx512vl(auVar111,local_980,auVar113);
      vandps_avx512vl(auVar111,auVar118);
      uVar25 = vcmpps_avx512vl(auVar111,auVar129,1);
      auVar118 = vxorps_avx512vl(auVar110,auVar130);
      auVar110 = vrcp14ps_avx512vl(auVar111);
      auVar112 = vxorps_avx512vl(auVar111,auVar130);
      auVar276 = ZEXT3264(auVar112);
      auVar113 = vfnmadd213ps_avx512vl(auVar110,auVar111,auVar126);
      auVar93 = vfmadd132ps_fma(auVar113,auVar110,auVar110);
      fVar261 = auVar93._0_4_ * auVar118._0_4_;
      fVar264 = auVar93._4_4_ * auVar118._4_4_;
      auVar46._4_4_ = fVar264;
      auVar46._0_4_ = fVar261;
      fVar265 = auVar93._8_4_ * auVar118._8_4_;
      auVar46._8_4_ = fVar265;
      fVar266 = auVar93._12_4_ * auVar118._12_4_;
      auVar46._12_4_ = fVar266;
      fVar250 = auVar118._16_4_ * 0.0;
      auVar46._16_4_ = fVar250;
      fVar235 = auVar118._20_4_ * 0.0;
      auVar46._20_4_ = fVar235;
      fVar238 = auVar118._24_4_ * 0.0;
      auVar46._24_4_ = fVar238;
      auVar46._28_4_ = auVar118._28_4_;
      uVar26 = vcmpps_avx512vl(auVar111,auVar112,1);
      bVar81 = (byte)uVar25 | (byte)uVar26;
      auVar113 = vblendmps_avx512vl(auVar46,auVar133);
      auVar136._0_4_ =
           (uint)(bVar81 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar110._0_4_;
      bVar11 = (bool)(bVar81 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar11 * auVar113._4_4_ | (uint)!bVar11 * auVar110._4_4_;
      bVar11 = (bool)(bVar81 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar11 * auVar113._8_4_ | (uint)!bVar11 * auVar110._8_4_;
      bVar11 = (bool)(bVar81 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar11 * auVar113._12_4_ | (uint)!bVar11 * auVar110._12_4_;
      bVar11 = (bool)(bVar81 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar11 * auVar113._16_4_ | (uint)!bVar11 * auVar110._16_4_;
      bVar11 = (bool)(bVar81 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar11 * auVar113._20_4_ | (uint)!bVar11 * auVar110._20_4_;
      bVar11 = (bool)(bVar81 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar11 * auVar113._24_4_ | (uint)!bVar11 * auVar110._24_4_;
      auVar136._28_4_ =
           (uint)(bVar81 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar81 >> 7) * auVar110._28_4_;
      _local_960 = vmaxps_avx(auVar116,auVar136);
      uVar26 = vcmpps_avx512vl(auVar111,auVar112,6);
      bVar81 = (byte)uVar25 | (byte)uVar26;
      auVar137._0_4_ = (uint)(bVar81 & 1) * 0x7f800000 | (uint)!(bool)(bVar81 & 1) * (int)fVar261;
      bVar11 = (bool)(bVar81 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar264;
      bVar11 = (bool)(bVar81 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar265;
      bVar11 = (bool)(bVar81 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar266;
      bVar11 = (bool)(bVar81 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar250;
      bVar11 = (bool)(bVar81 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar235;
      bVar11 = (bool)(bVar81 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar238;
      auVar137._28_4_ =
           (uint)(bVar81 >> 7) * 0x7f800000 | (uint)!(bool)(bVar81 >> 7) * auVar118._28_4_;
      local_760 = vminps_avx(auVar117,auVar137);
      auVar263 = ZEXT3264(local_760);
      uVar25 = vcmpps_avx512vl(_local_960,local_760,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar25;
      if (bVar74 == 0) {
        auVar177 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar272 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar117 = vmaxps_avx512vl(auVar120,auVar106);
        auVar106 = vminps_avx512vl(local_820,auVar126);
        auVar54 = ZEXT412(0);
        auVar116 = ZEXT1232(auVar54) << 0x20;
        auVar106 = vmaxps_avx(auVar106,ZEXT1232(auVar54) << 0x20);
        auVar118 = vminps_avx512vl(local_840,auVar126);
        auVar47._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar106._28_4_ + 7.0;
        auVar93 = vfmadd213ps_fma(auVar47,auVar167,auVar231);
        local_820 = ZEXT1632(auVar93);
        auVar106 = vmaxps_avx(auVar118,ZEXT1232(auVar54) << 0x20);
        auVar48._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar106._28_4_ + 7.0;
        auVar93 = vfmadd213ps_fma(auVar48,auVar167,auVar231);
        local_840 = ZEXT1632(auVar93);
        auVar223._0_4_ = auVar117._0_4_ * auVar117._0_4_;
        auVar223._4_4_ = auVar117._4_4_ * auVar117._4_4_;
        auVar223._8_4_ = auVar117._8_4_ * auVar117._8_4_;
        auVar223._12_4_ = auVar117._12_4_ * auVar117._12_4_;
        auVar223._16_4_ = auVar117._16_4_ * auVar117._16_4_;
        auVar223._20_4_ = auVar117._20_4_ * auVar117._20_4_;
        auVar223._24_4_ = auVar117._24_4_ * auVar117._24_4_;
        auVar223._28_4_ = 0;
        auVar106 = vsubps_avx(local_b20,auVar223);
        auVar117 = vmulps_avx512vl(auVar119,auVar106);
        auVar117 = vsubps_avx512vl(auVar123,auVar117);
        uVar25 = vcmpps_avx512vl(auVar117,ZEXT1232(auVar54) << 0x20,5);
        bVar81 = (byte)uVar25;
        if (bVar81 == 0) {
          auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar105 = ZEXT832(0) << 0x20;
          auVar118 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar119 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar117 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar138._8_4_ = 0x7f800000;
          auVar138._0_8_ = 0x7f8000007f800000;
          auVar138._12_4_ = 0x7f800000;
          auVar138._16_4_ = 0x7f800000;
          auVar138._20_4_ = 0x7f800000;
          auVar138._24_4_ = 0x7f800000;
          auVar138._28_4_ = 0x7f800000;
          auVar139._8_4_ = 0xff800000;
          auVar139._0_8_ = 0xff800000ff800000;
          auVar139._12_4_ = 0xff800000;
          auVar139._16_4_ = 0xff800000;
          auVar139._20_4_ = 0xff800000;
          auVar139._24_4_ = 0xff800000;
          auVar139._28_4_ = 0xff800000;
        }
        else {
          auVar92 = vxorps_avx512vl(auVar119._0_16_,auVar119._0_16_);
          uVar86 = vcmpps_avx512vl(auVar117,auVar120,5);
          auVar116 = vsqrtps_avx(auVar117);
          auVar233._0_4_ = auVar104._0_4_ + auVar104._0_4_;
          auVar233._4_4_ = auVar104._4_4_ + auVar104._4_4_;
          auVar233._8_4_ = auVar104._8_4_ + auVar104._8_4_;
          auVar233._12_4_ = auVar104._12_4_ + auVar104._12_4_;
          auVar233._16_4_ = auVar104._16_4_ + auVar104._16_4_;
          auVar233._20_4_ = auVar104._20_4_ + auVar104._20_4_;
          auVar233._24_4_ = auVar104._24_4_ + auVar104._24_4_;
          auVar233._28_4_ = auVar104._28_4_ + auVar104._28_4_;
          auVar117 = vrcp14ps_avx512vl(auVar233);
          auVar118 = vfnmadd213ps_avx512vl(auVar233,auVar117,auVar126);
          auVar93 = vfmadd132ps_fma(auVar118,auVar117,auVar117);
          auVar37._8_4_ = 0x80000000;
          auVar37._0_8_ = 0x8000000080000000;
          auVar37._12_4_ = 0x80000000;
          auVar37._16_4_ = 0x80000000;
          auVar37._20_4_ = 0x80000000;
          auVar37._24_4_ = 0x80000000;
          auVar37._28_4_ = 0x80000000;
          auVar117 = vxorps_avx512vl(auVar122,auVar37);
          auVar117 = vsubps_avx(auVar117,auVar116);
          auVar49._4_4_ = auVar117._4_4_ * auVar93._4_4_;
          auVar49._0_4_ = auVar117._0_4_ * auVar93._0_4_;
          auVar49._8_4_ = auVar117._8_4_ * auVar93._8_4_;
          auVar49._12_4_ = auVar117._12_4_ * auVar93._12_4_;
          auVar49._16_4_ = auVar117._16_4_ * 0.0;
          auVar49._20_4_ = auVar117._20_4_ * 0.0;
          auVar49._24_4_ = auVar117._24_4_ * 0.0;
          auVar49._28_4_ = 0x3e000000;
          auVar116 = vsubps_avx512vl(auVar116,auVar122);
          auVar50._4_4_ = auVar116._4_4_ * auVar93._4_4_;
          auVar50._0_4_ = auVar116._0_4_ * auVar93._0_4_;
          auVar50._8_4_ = auVar116._8_4_ * auVar93._8_4_;
          auVar50._12_4_ = auVar116._12_4_ * auVar93._12_4_;
          auVar50._16_4_ = auVar116._16_4_ * 0.0;
          auVar50._20_4_ = auVar116._20_4_ * 0.0;
          auVar50._24_4_ = auVar116._24_4_ * 0.0;
          auVar50._28_4_ = 0x7f800000;
          auVar282 = ZEXT3264(auVar50);
          auVar116 = vfmadd213ps_avx512vl(auVar121,auVar49,auVar109);
          auVar51._4_4_ = auVar103._4_4_ * auVar116._4_4_;
          auVar51._0_4_ = auVar103._0_4_ * auVar116._0_4_;
          auVar51._8_4_ = auVar103._8_4_ * auVar116._8_4_;
          auVar51._12_4_ = auVar103._12_4_ * auVar116._12_4_;
          auVar51._16_4_ = auVar103._16_4_ * auVar116._16_4_;
          auVar51._20_4_ = auVar103._20_4_ * auVar116._20_4_;
          auVar51._24_4_ = auVar103._24_4_ * auVar116._24_4_;
          auVar51._28_4_ = auVar117._28_4_;
          auVar116 = vmulps_avx512vl(local_980,auVar49);
          auVar117 = vmulps_avx512vl(auVar101,auVar49);
          auVar110 = vmulps_avx512vl(local_aa0,auVar49);
          auVar118 = vfmadd213ps_avx512vl(auVar105,auVar51,local_8e0);
          auVar118 = vsubps_avx512vl(auVar116,auVar118);
          auVar116 = vfmadd213ps_avx512vl(auVar107,auVar51,local_b00);
          auVar119 = vsubps_avx512vl(auVar117,auVar116);
          auVar93 = vfmadd213ps_fma(auVar51,local_900,auVar108);
          auVar117 = vsubps_avx(auVar110,ZEXT1632(auVar93));
          auVar109 = vfmadd213ps_avx512vl(auVar121,auVar50,auVar109);
          auVar109 = vmulps_avx512vl(auVar103,auVar109);
          auVar283 = ZEXT3264(auVar109);
          auVar103 = vmulps_avx512vl(local_980,auVar50);
          auVar110 = vmulps_avx512vl(auVar101,auVar50);
          auVar111 = vmulps_avx512vl(local_aa0,auVar50);
          auVar93 = vfmadd213ps_fma(auVar105,auVar109,local_8e0);
          auVar116 = vsubps_avx(auVar103,ZEXT1632(auVar93));
          auVar93 = vfmadd213ps_fma(auVar107,auVar109,local_b00);
          auVar103 = vsubps_avx512vl(auVar110,ZEXT1632(auVar93));
          auVar93 = vfmadd213ps_fma(local_900,auVar109,auVar108);
          auVar105 = vsubps_avx512vl(auVar111,ZEXT1632(auVar93));
          auVar168._8_4_ = 0x7f800000;
          auVar168._0_8_ = 0x7f8000007f800000;
          auVar168._12_4_ = 0x7f800000;
          auVar168._16_4_ = 0x7f800000;
          auVar168._20_4_ = 0x7f800000;
          auVar168._24_4_ = 0x7f800000;
          auVar168._28_4_ = 0x7f800000;
          auVar107 = vblendmps_avx512vl(auVar168,auVar49);
          bVar11 = (bool)((byte)uVar86 & 1);
          auVar138._0_4_ = (uint)bVar11 * auVar107._0_4_ | (uint)!bVar11 * auVar91._0_4_;
          bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar11 * auVar107._4_4_ | (uint)!bVar11 * auVar91._4_4_;
          bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar11 * auVar107._8_4_ | (uint)!bVar11 * auVar91._8_4_;
          bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar11 * auVar107._12_4_ | (uint)!bVar11 * auVar91._12_4_;
          iVar1 = (uint)((byte)(uVar86 >> 4) & 1) * auVar107._16_4_;
          auVar138._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar86 >> 5) & 1) * auVar107._20_4_;
          auVar138._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar86 >> 6) & 1) * auVar107._24_4_;
          auVar138._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar86 >> 7) * auVar107._28_4_;
          auVar138._28_4_ = iVar4;
          auVar169._8_4_ = 0xff800000;
          auVar169._0_8_ = 0xff800000ff800000;
          auVar169._12_4_ = 0xff800000;
          auVar169._16_4_ = 0xff800000;
          auVar169._20_4_ = 0xff800000;
          auVar169._24_4_ = 0xff800000;
          auVar169._28_4_ = 0xff800000;
          auVar107 = vblendmps_avx512vl(auVar169,auVar50);
          bVar11 = (bool)((byte)uVar86 & 1);
          auVar139._0_4_ = (uint)bVar11 * auVar107._0_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar11 * auVar107._4_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar11 * auVar107._8_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar11 * auVar107._12_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar86 >> 4) & 1);
          auVar139._16_4_ = (uint)bVar11 * auVar107._16_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
          auVar139._20_4_ = (uint)bVar11 * auVar107._20_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar86 >> 6) & 1);
          auVar139._24_4_ = (uint)bVar11 * auVar107._24_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = SUB81(uVar86 >> 7,0);
          auVar139._28_4_ = (uint)bVar11 * auVar107._28_4_ | (uint)!bVar11 * -0x800000;
          auVar253._8_4_ = 0x7fffffff;
          auVar253._0_8_ = 0x7fffffff7fffffff;
          auVar253._12_4_ = 0x7fffffff;
          auVar253._16_4_ = 0x7fffffff;
          auVar253._20_4_ = 0x7fffffff;
          auVar253._24_4_ = 0x7fffffff;
          auVar253._28_4_ = 0x7fffffff;
          auVar107 = vandps_avx(auVar253,local_920);
          auVar107 = vmaxps_avx(local_7c0,auVar107);
          auVar38._8_4_ = 0x36000000;
          auVar38._0_8_ = 0x3600000036000000;
          auVar38._12_4_ = 0x36000000;
          auVar38._16_4_ = 0x36000000;
          auVar38._20_4_ = 0x36000000;
          auVar38._24_4_ = 0x36000000;
          auVar38._28_4_ = 0x36000000;
          auVar107 = vmulps_avx512vl(auVar107,auVar38);
          auVar104 = vandps_avx(auVar104,auVar253);
          uVar77 = vcmpps_avx512vl(auVar104,auVar107,1);
          uVar86 = uVar86 & uVar77;
          bVar78 = (byte)uVar86;
          if (bVar78 != 0) {
            uVar77 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar92),2);
            auVar254._8_4_ = 0xff800000;
            auVar254._0_8_ = 0xff800000ff800000;
            auVar254._12_4_ = 0xff800000;
            auVar254._16_4_ = 0xff800000;
            auVar254._20_4_ = 0xff800000;
            auVar254._24_4_ = 0xff800000;
            auVar254._28_4_ = 0xff800000;
            auVar275._8_4_ = 0x7f800000;
            auVar275._0_8_ = 0x7f8000007f800000;
            auVar275._12_4_ = 0x7f800000;
            auVar275._16_4_ = 0x7f800000;
            auVar275._20_4_ = 0x7f800000;
            auVar275._24_4_ = 0x7f800000;
            auVar275._28_4_ = 0x7f800000;
            auVar104 = vblendmps_avx512vl(auVar275,auVar254);
            bVar80 = (byte)uVar77;
            uVar79 = (uint)(bVar80 & 1) * auVar104._0_4_ |
                     (uint)!(bool)(bVar80 & 1) * auVar107._0_4_;
            bVar11 = (bool)((byte)(uVar77 >> 1) & 1);
            uVar151 = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * auVar107._4_4_;
            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
            uVar152 = (uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * auVar107._8_4_;
            bVar11 = (bool)((byte)(uVar77 >> 3) & 1);
            uVar153 = (uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * auVar107._12_4_;
            bVar11 = (bool)((byte)(uVar77 >> 4) & 1);
            uVar154 = (uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * auVar107._16_4_;
            bVar11 = (bool)((byte)(uVar77 >> 5) & 1);
            uVar155 = (uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * auVar107._20_4_;
            bVar11 = (bool)((byte)(uVar77 >> 6) & 1);
            uVar156 = (uint)bVar11 * auVar104._24_4_ | (uint)!bVar11 * auVar107._24_4_;
            bVar11 = SUB81(uVar77 >> 7,0);
            uVar157 = (uint)bVar11 * auVar104._28_4_ | (uint)!bVar11 * auVar107._28_4_;
            auVar138._0_4_ = (bVar78 & 1) * uVar79 | !(bool)(bVar78 & 1) * auVar138._0_4_;
            bVar11 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar138._4_4_ = bVar11 * uVar151 | !bVar11 * auVar138._4_4_;
            bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar138._8_4_ = bVar11 * uVar152 | !bVar11 * auVar138._8_4_;
            bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar138._12_4_ = bVar11 * uVar153 | !bVar11 * auVar138._12_4_;
            bVar11 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar138._16_4_ = bVar11 * uVar154 | (uint)!bVar11 * iVar1;
            bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar138._20_4_ = bVar11 * uVar155 | (uint)!bVar11 * iVar2;
            bVar11 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar138._24_4_ = bVar11 * uVar156 | (uint)!bVar11 * iVar3;
            bVar11 = SUB81(uVar86 >> 7,0);
            auVar138._28_4_ = bVar11 * uVar157 | (uint)!bVar11 * iVar4;
            auVar104 = vblendmps_avx512vl(auVar254,auVar275);
            bVar11 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar77 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar77 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar77 >> 6) & 1);
            bVar17 = SUB81(uVar77 >> 7,0);
            auVar139._0_4_ =
                 (uint)(bVar78 & 1) *
                 ((uint)(bVar80 & 1) * auVar104._0_4_ | !(bool)(bVar80 & 1) * uVar79) |
                 !(bool)(bVar78 & 1) * auVar139._0_4_;
            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar139._4_4_ =
                 (uint)bVar85 * ((uint)bVar11 * auVar104._4_4_ | !bVar11 * uVar151) |
                 !bVar85 * auVar139._4_4_;
            bVar11 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar139._8_4_ =
                 (uint)bVar11 * ((uint)bVar12 * auVar104._8_4_ | !bVar12 * uVar152) |
                 !bVar11 * auVar139._8_4_;
            bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar139._12_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar104._12_4_ | !bVar13 * uVar153) |
                 !bVar11 * auVar139._12_4_;
            bVar11 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar139._16_4_ =
                 (uint)bVar11 * ((uint)bVar14 * auVar104._16_4_ | !bVar14 * uVar154) |
                 !bVar11 * auVar139._16_4_;
            bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar139._20_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar104._20_4_ | !bVar15 * uVar155) |
                 !bVar11 * auVar139._20_4_;
            bVar11 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar139._24_4_ =
                 (uint)bVar11 * ((uint)bVar16 * auVar104._24_4_ | !bVar16 * uVar156) |
                 !bVar11 * auVar139._24_4_;
            bVar11 = SUB81(uVar86 >> 7,0);
            auVar139._28_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar104._28_4_ | !bVar17 * uVar157) |
                 !bVar11 * auVar139._28_4_;
            bVar81 = (~bVar78 | bVar80) & bVar81;
          }
        }
        auVar273._8_4_ = 0x7fffffff;
        auVar273._0_8_ = 0x7fffffff7fffffff;
        auVar273._12_4_ = 0x7fffffff;
        auVar276 = ZEXT1664(auVar273);
        auVar104 = vmulps_avx512vl(local_aa0,auVar105);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar103);
        auVar91 = vfmadd231ps_fma(auVar104,local_980,auVar116);
        _local_500 = _local_960;
        local_4e0 = vminps_avx(local_760,auVar138);
        auVar249._8_4_ = 0x7fffffff;
        auVar249._0_8_ = 0x7fffffff7fffffff;
        auVar249._12_4_ = 0x7fffffff;
        auVar249._16_4_ = 0x7fffffff;
        auVar249._20_4_ = 0x7fffffff;
        auVar249._24_4_ = 0x7fffffff;
        auVar249._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(ZEXT1632(auVar91),auVar249);
        _local_880 = vmaxps_avx(_local_960,auVar139);
        _local_780 = _local_880;
        auVar170._8_4_ = 0x3e99999a;
        auVar170._0_8_ = 0x3e99999a3e99999a;
        auVar170._12_4_ = 0x3e99999a;
        auVar170._16_4_ = 0x3e99999a;
        auVar170._20_4_ = 0x3e99999a;
        auVar170._24_4_ = 0x3e99999a;
        auVar170._28_4_ = 0x3e99999a;
        uVar25 = vcmpps_avx512vl(auVar104,auVar170,1);
        uVar26 = vcmpps_avx512vl(_local_960,local_4e0,2);
        bVar78 = (byte)uVar26 & bVar74;
        uVar27 = vcmpps_avx512vl(_local_880,local_760,2);
        if ((bVar74 & ((byte)uVar27 | (byte)uVar26)) == 0) {
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        else {
          auVar104 = vmulps_avx512vl(local_aa0,auVar117);
          auVar104 = vfmadd213ps_avx512vl(auVar119,auVar101,auVar104);
          auVar91 = vfmadd213ps_fma(auVar118,local_980,auVar104);
          auVar104 = vandps_avx(ZEXT1632(auVar91),auVar249);
          uVar26 = vcmpps_avx512vl(auVar104,auVar170,1);
          bVar80 = (byte)uVar26 | ~bVar81;
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar104 = vpblendmd_avx512vl(auVar171,auVar39);
          local_740._0_4_ = (uint)(bVar80 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
          bVar11 = (bool)(bVar80 >> 1 & 1);
          local_740._4_4_ = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar80 >> 2 & 1);
          local_740._8_4_ = (uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar80 >> 3 & 1);
          local_740._12_4_ = (uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar80 >> 4 & 1);
          local_740._16_4_ = (uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar80 >> 5 & 1);
          local_740._20_4_ = (uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar80 >> 6 & 1);
          local_740._24_4_ = (uint)bVar11 * auVar104._24_4_ | (uint)!bVar11 * 2;
          local_740._28_4_ = (uint)(bVar80 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
          auVar177._0_32_ = vpbroadcastd_avx512vl();
          auVar177._32_32_ = auVar102;
          local_7e0 = auVar177._0_32_;
          uVar26 = vpcmpd_avx512vl(auVar177._0_32_,local_740,5);
          bVar80 = (byte)uVar26 & bVar78;
          if (bVar80 != 0) {
            auVar93 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar91 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar92 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar100 = vminps_avx(auVar93,auVar92);
            auVar93 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar92 = vmaxps_avx(auVar91,auVar93);
            auVar91 = vandps_avx(auVar273,auVar100);
            auVar93 = vandps_avx(auVar273,auVar92);
            auVar91 = vmaxps_avx(auVar91,auVar93);
            auVar93 = vmovshdup_avx(auVar91);
            auVar93 = vmaxss_avx(auVar93,auVar91);
            auVar91 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vmaxss_avx(auVar91,auVar93);
            fVar261 = auVar91._0_4_ * 1.9073486e-06;
            local_9d0 = vshufps_avx(auVar92,auVar92,0xff);
            local_860 = (float)local_960._0_4_ + (float)local_940._0_4_;
            fStack_85c = (float)local_960._4_4_ + (float)local_940._4_4_;
            fStack_858 = fStack_958 + fStack_938;
            fStack_854 = fStack_954 + fStack_934;
            fStack_850 = fStack_950 + fStack_930;
            fStack_84c = fStack_94c + fStack_92c;
            fStack_848 = fStack_948 + fStack_928;
            fStack_844 = fStack_944 + fStack_924;
            do {
              auVar172._8_4_ = 0x7f800000;
              auVar172._0_8_ = 0x7f8000007f800000;
              auVar172._12_4_ = 0x7f800000;
              auVar172._16_4_ = 0x7f800000;
              auVar172._20_4_ = 0x7f800000;
              auVar172._24_4_ = 0x7f800000;
              auVar172._28_4_ = 0x7f800000;
              auVar102 = vblendmps_avx512vl(auVar172,_local_960);
              auVar140._0_4_ =
                   (uint)(bVar80 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar80 >> 1 & 1);
              auVar140._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar80 >> 2 & 1);
              auVar140._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar80 >> 3 & 1);
              auVar140._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar80 >> 4 & 1);
              auVar140._16_4_ = (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar80 >> 5 & 1);
              auVar140._20_4_ = (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar140._24_4_ =
                   (uint)(bVar80 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar177._0_32_ = auVar140;
              auVar102 = vshufps_avx(auVar140,auVar140,0xb1);
              auVar102 = vminps_avx(auVar140,auVar102);
              auVar104 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar104);
              auVar104 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar104);
              uVar26 = vcmpps_avx512vl(auVar140,auVar102,0);
              bVar75 = (byte)uVar26 & bVar80;
              bVar76 = bVar80;
              if (bVar75 != 0) {
                bVar76 = bVar75;
              }
              iVar2 = 0;
              for (uVar79 = (uint)bVar76; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar79 = *(uint *)(local_820 + (uint)(iVar2 << 2));
              uVar151 = *(uint *)(local_500 + (uint)(iVar2 << 2));
              fVar264 = auVar88._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar264 = sqrtf((float)local_a80._0_4_);
              }
              auVar272 = ZEXT464(uVar79);
              auVar263 = ZEXT464(uVar151);
              lVar84 = 4;
              do {
                auVar102 = auVar177._32_32_;
                fVar265 = auVar263._0_4_;
                auVar159._4_4_ = fVar265;
                auVar159._0_4_ = fVar265;
                auVar159._8_4_ = fVar265;
                auVar159._12_4_ = fVar265;
                auVar91 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_a70);
                fVar240 = auVar272._0_4_;
                fVar239 = 1.0 - fVar240;
                auVar95 = SUB6416(ZEXT464(0x40400000),0);
                auVar94 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar268 = auVar272._0_16_;
                auVar92 = vfmadd213ss_fma(auVar95,auVar268,auVar94);
                auVar93 = vfmadd213ss_fma(auVar92,ZEXT416((uint)(fVar240 * fVar240)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar100 = vfmadd213ss_fma(auVar95,ZEXT416((uint)fVar239),auVar94);
                auVar100 = vfmadd213ss_fma(auVar100,ZEXT416((uint)(fVar239 * fVar239)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar266 = fVar239 * fVar239 * -fVar240 * 0.5;
                fVar250 = auVar93._0_4_ * 0.5;
                fVar235 = auVar100._0_4_ * 0.5;
                fVar238 = fVar240 * fVar240 * -fVar239 * 0.5;
                auVar215._0_4_ = fVar238 * (float)local_a60._0_4_;
                auVar215._4_4_ = fVar238 * (float)local_a60._4_4_;
                auVar215._8_4_ = fVar238 * fStack_a58;
                auVar215._12_4_ = fVar238 * fStack_a54;
                auVar227._4_4_ = fVar235;
                auVar227._0_4_ = fVar235;
                auVar227._8_4_ = fVar235;
                auVar227._12_4_ = fVar235;
                auVar93 = vfmadd132ps_fma(auVar227,auVar215,local_a20._0_16_);
                auVar201._4_4_ = fVar250;
                auVar201._0_4_ = fVar250;
                auVar201._8_4_ = fVar250;
                auVar201._12_4_ = fVar250;
                auVar93 = vfmadd132ps_fma(auVar201,auVar93,local_a40._0_16_);
                auVar216._4_4_ = fVar266;
                auVar216._0_4_ = fVar266;
                auVar216._8_4_ = fVar266;
                auVar216._12_4_ = fVar266;
                auVar93 = vfmadd132ps_fma(auVar216,auVar93,local_a00._0_16_);
                auVar100 = vfmadd231ss_fma(auVar94,auVar268,ZEXT416(0x41100000));
                local_900._0_16_ = auVar100;
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar268,
                                           ZEXT416(0x40800000));
                local_920._0_16_ = auVar100;
                local_990 = vfmadd213ss_fma(auVar95,auVar268,ZEXT416(0xbf800000));
                local_8e0._0_16_ = auVar93;
                auVar93 = vsubps_avx(auVar91,auVar93);
                auVar91 = vdpps_avx(auVar93,auVar93,0x7f);
                fVar266 = auVar91._0_4_;
                if (fVar266 < 0.0) {
                  local_b00._0_4_ = auVar92._0_4_;
                  local_b20._0_16_ = ZEXT416((uint)fVar239);
                  auVar282._0_4_ = sqrtf(fVar266);
                  auVar282._4_60_ = extraout_var;
                  auVar92 = ZEXT416((uint)local_b00._0_4_);
                  auVar100 = auVar282._0_16_;
                  auVar94 = local_b20._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar91,auVar91);
                  auVar94 = ZEXT416((uint)fVar239);
                }
                fVar250 = auVar94._0_4_;
                auVar89 = vfnmadd231ss_fma(ZEXT416((uint)(fVar240 * (fVar250 + fVar250))),auVar94,
                                           auVar94);
                auVar92 = vfmadd213ss_fma(auVar92,ZEXT416((uint)(fVar240 + fVar240)),
                                          ZEXT416((uint)(fVar240 * fVar240 * 3.0)));
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar268,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar250 * -3.0)),
                                          ZEXT416((uint)(fVar250 + fVar250)),auVar94);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar239 * -2.0)),auVar268,
                                          ZEXT416((uint)(fVar240 * fVar240)));
                fVar250 = auVar89._0_4_ * 0.5;
                fVar235 = auVar92._0_4_ * 0.5;
                fVar238 = auVar95._0_4_ * 0.5;
                fVar239 = auVar94._0_4_ * 0.5;
                auVar217._0_4_ = fVar239 * (float)local_a60._0_4_;
                auVar217._4_4_ = fVar239 * (float)local_a60._4_4_;
                auVar217._8_4_ = fVar239 * fStack_a58;
                auVar217._12_4_ = fVar239 * fStack_a54;
                auVar202._4_4_ = fVar238;
                auVar202._0_4_ = fVar238;
                auVar202._8_4_ = fVar238;
                auVar202._12_4_ = fVar238;
                auVar92 = vfmadd132ps_fma(auVar202,auVar217,local_a20._0_16_);
                auVar180._4_4_ = fVar235;
                auVar180._0_4_ = fVar235;
                auVar180._8_4_ = fVar235;
                auVar180._12_4_ = fVar235;
                auVar92 = vfmadd132ps_fma(auVar180,auVar92,local_a40._0_16_);
                auVar280._4_4_ = fVar250;
                auVar280._0_4_ = fVar250;
                auVar280._8_4_ = fVar250;
                auVar280._12_4_ = fVar250;
                local_b00._0_16_ = vfmadd132ps_fma(auVar280,auVar92,local_a00._0_16_);
                auVar92 = vdpps_avx(local_b00._0_16_,local_b00._0_16_,0x7f);
                auVar55._12_4_ = 0;
                auVar55._0_12_ = ZEXT812(0);
                fVar250 = auVar92._0_4_;
                auVar94 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar250));
                fVar235 = auVar94._0_4_;
                auVar95 = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar250));
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar89 = vxorps_avx512vl(auVar92,auVar29);
                auVar94 = vfnmadd213ss_fma(auVar95,auVar92,SUB6416(ZEXT464(0x40000000),0));
                local_b20._0_4_ = auVar100._0_4_;
                if (fVar250 < auVar89._0_4_) {
                  auVar283._0_4_ = sqrtf(fVar250);
                  auVar283._4_60_ = extraout_var_00;
                  auVar100 = ZEXT416((uint)local_b20._0_4_);
                  auVar89 = auVar283._0_16_;
                  auVar92 = local_b00._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx512f(auVar92,auVar92);
                  auVar92 = local_b00._0_16_;
                }
                fVar235 = fVar235 * 1.5 + fVar250 * -0.5 * fVar235 * fVar235 * fVar235;
                auVar160._0_4_ = auVar92._0_4_ * fVar235;
                auVar160._4_4_ = auVar92._4_4_ * fVar235;
                auVar160._8_4_ = auVar92._8_4_ * fVar235;
                auVar160._12_4_ = auVar92._12_4_ * fVar235;
                auVar87 = vdpps_avx(auVar93,auVar160,0x7f);
                fVar241 = auVar100._0_4_;
                fVar238 = auVar87._0_4_;
                auVar161._0_4_ = fVar238 * fVar238;
                auVar161._4_4_ = auVar87._4_4_ * auVar87._4_4_;
                auVar161._8_4_ = auVar87._8_4_ * auVar87._8_4_;
                auVar161._12_4_ = auVar87._12_4_ * auVar87._12_4_;
                auVar96 = vsubps_avx512vl(auVar91,auVar161);
                fVar239 = auVar96._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar239;
                auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar98 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
                auVar99 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
                if (fVar239 < 0.0) {
                  local_9b0 = fVar235;
                  fStack_9ac = fVar235;
                  fStack_9a8 = fVar235;
                  fStack_9a4 = fVar235;
                  local_9a0 = auVar97;
                  fVar239 = sqrtf(fVar239);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar98 = ZEXT416(auVar98._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar100 = ZEXT416((uint)local_b20._0_4_);
                  auVar92 = local_b00._0_16_;
                  auVar97 = local_9a0;
                  fVar235 = local_9b0;
                  fVar242 = fStack_9ac;
                  fVar243 = fStack_9a8;
                  fVar251 = fStack_9a4;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  fVar239 = auVar96._0_4_;
                  fVar242 = fVar235;
                  fVar243 = fVar235;
                  fVar251 = fVar235;
                }
                auVar285 = ZEXT1664(auVar87);
                auVar282 = ZEXT1664(auVar92);
                auVar274._8_4_ = 0x7fffffff;
                auVar274._0_8_ = 0x7fffffff7fffffff;
                auVar274._12_4_ = 0x7fffffff;
                auVar276 = ZEXT1664(auVar274);
                auVar144._32_32_ = auVar102;
                auVar144._0_32_ = local_aa0;
                auVar286 = ZEXT3264(local_aa0);
                auVar182._0_4_ = (float)local_990._0_4_ * (float)local_a60._0_4_;
                auVar182._4_4_ = (float)local_990._0_4_ * (float)local_a60._4_4_;
                auVar182._8_4_ = (float)local_990._0_4_ * fStack_a58;
                auVar182._12_4_ = (float)local_990._0_4_ * fStack_a54;
                auVar203._4_4_ = local_920._0_4_;
                auVar203._0_4_ = local_920._0_4_;
                auVar203._8_4_ = local_920._0_4_;
                auVar203._12_4_ = local_920._0_4_;
                auVar96 = vfmadd132ps_fma(auVar203,auVar182,local_a20._0_16_);
                auVar183._4_4_ = local_900._0_4_;
                auVar183._0_4_ = local_900._0_4_;
                auVar183._8_4_ = local_900._0_4_;
                auVar183._12_4_ = local_900._0_4_;
                auVar96 = vfmadd132ps_fma(auVar183,auVar96,local_a40._0_16_);
                auVar268 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar268,
                                           ZEXT416(0x40000000));
                auVar204._0_4_ = auVar268._0_4_;
                auVar204._4_4_ = auVar204._0_4_;
                auVar204._8_4_ = auVar204._0_4_;
                auVar204._12_4_ = auVar204._0_4_;
                auVar268 = vfmadd132ps_fma(auVar204,auVar96,local_a00._0_16_);
                auVar184._0_4_ = auVar268._0_4_ * fVar250;
                auVar184._4_4_ = auVar268._4_4_ * fVar250;
                auVar184._8_4_ = auVar268._8_4_ * fVar250;
                auVar184._12_4_ = auVar268._12_4_ * fVar250;
                auVar268 = vdpps_avx(auVar92,auVar268,0x7f);
                fVar250 = auVar268._0_4_;
                auVar205._0_4_ = auVar92._0_4_ * fVar250;
                auVar205._4_4_ = auVar92._4_4_ * fVar250;
                auVar205._8_4_ = auVar92._8_4_ * fVar250;
                auVar205._12_4_ = auVar92._12_4_ * fVar250;
                auVar268 = vsubps_avx(auVar184,auVar205);
                local_be0 = auVar95._0_4_;
                local_be0 = auVar94._0_4_ * local_be0;
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar177._16_48_ = auVar144._16_48_;
                auVar96 = vxorps_avx512vl(auVar92,auVar30);
                auVar228._0_4_ = fVar235 * auVar268._0_4_ * local_be0;
                auVar228._4_4_ = fVar242 * auVar268._4_4_ * local_be0;
                auVar228._8_4_ = fVar243 * auVar268._8_4_ * local_be0;
                auVar228._12_4_ = fVar251 * auVar268._12_4_ * local_be0;
                auVar94 = vdpps_avx(auVar96,auVar160,0x7f);
                auVar268 = vmaxss_avx(ZEXT416((uint)fVar261),
                                      ZEXT416((uint)(fVar265 * fVar264 * 1.9073486e-06)));
                auVar89 = vdivss_avx512f(ZEXT416((uint)fVar261),auVar89);
                auVar95 = vdpps_avx(auVar93,auVar228,0x7f);
                auVar100 = vfmadd213ss_fma(auVar100,ZEXT416((uint)fVar261),auVar268);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),auVar89,auVar100);
                auVar283 = ZEXT1664(auVar89);
                auVar100 = vdpps_avx(local_a70,auVar160,0x7f);
                fVar250 = auVar94._0_4_ + auVar95._0_4_;
                auVar94 = vdpps_avx(auVar93,auVar96,0x7f);
                auVar96 = vmulss_avx512f(auVar99,auVar97);
                auVar97 = vmulss_avx512f(auVar97,auVar97);
                auVar95 = vdpps_avx(auVar93,local_a70,0x7f);
                auVar177._0_16_ =
                     vaddss_avx512f(auVar98,ZEXT416((uint)(auVar96._0_4_ * auVar97._0_4_)));
                auVar97 = vfnmadd231ss_fma(auVar94,auVar87,ZEXT416((uint)fVar250));
                auVar96 = vfnmadd231ss_fma(auVar95,auVar87,auVar100);
                auVar94 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar239 = fVar239 - auVar94._0_4_;
                auVar94 = vshufps_avx(auVar92,auVar92,0xff);
                auVar95 = vfmsub213ss_fma(auVar97,auVar177._0_16_,auVar94);
                fVar235 = auVar96._0_4_ * auVar177._0_4_;
                auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * auVar95._0_4_)),
                                          ZEXT416((uint)fVar250),ZEXT416((uint)fVar235));
                fVar241 = auVar97._0_4_;
                fVar240 = fVar240 - (fVar238 * (fVar235 / fVar241) -
                                    fVar239 * (auVar100._0_4_ / fVar241));
                auVar272 = ZEXT464((uint)fVar240);
                fVar265 = fVar265 - (fVar239 * (fVar250 / fVar241) -
                                    fVar238 * (auVar95._0_4_ / fVar241));
                auVar263 = ZEXT464((uint)fVar265);
                auVar100 = vandps_avx(auVar87,auVar274);
                if (auVar89._0_4_ <= auVar100._0_4_) {
LAB_01b59a60:
                  bVar11 = false;
                }
                else {
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ + auVar268._0_4_)),
                                            local_9d0,ZEXT416(0x36000000));
                  auVar100 = vandps_avx(auVar274,ZEXT416((uint)fVar239));
                  if (auVar95._0_4_ <= auVar100._0_4_) goto LAB_01b59a60;
                  fVar265 = fVar265 + (float)local_9c0._0_4_;
                  auVar263 = ZEXT464((uint)fVar265);
                  bVar11 = true;
                  if ((((fVar158 <= fVar265) &&
                       (fVar250 = *(float *)(ray + k * 4 + 0x200), fVar265 <= fVar250)) &&
                      (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                    auVar146._16_48_ = auVar177._16_48_;
                    auVar146._0_16_ = ZEXT816(0) << 0x20;
                    auVar145._4_60_ = auVar146._4_60_;
                    auVar145._0_4_ = fVar266;
                    auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar145._0_16_);
                    fVar266 = auVar100._0_4_;
                    auVar177._0_16_ = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                    pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar266 = fVar266 * 1.5 + auVar177._0_4_ * fVar266 * fVar266 * fVar266;
                      auVar185._0_4_ = auVar93._0_4_ * fVar266;
                      auVar185._4_4_ = auVar93._4_4_ * fVar266;
                      auVar185._8_4_ = auVar93._8_4_ * fVar266;
                      auVar185._12_4_ = auVar93._12_4_ * fVar266;
                      auVar94 = vfmadd213ps_fma(auVar94,auVar185,auVar92);
                      auVar91 = vshufps_avx(auVar185,auVar185,0xc9);
                      auVar93 = vshufps_avx(auVar92,auVar92,0xc9);
                      auVar186._0_4_ = auVar185._0_4_ * auVar93._0_4_;
                      auVar186._4_4_ = auVar185._4_4_ * auVar93._4_4_;
                      auVar186._8_4_ = auVar185._8_4_ * auVar93._8_4_;
                      auVar186._12_4_ = auVar185._12_4_ * auVar93._12_4_;
                      auVar100 = vfmsub231ps_fma(auVar186,auVar92,auVar91);
                      auVar91 = vshufps_avx(auVar100,auVar100,0xc9);
                      auVar93 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar100 = vshufps_avx(auVar100,auVar100,0xd2);
                      auVar162._0_4_ = auVar94._0_4_ * auVar100._0_4_;
                      auVar162._4_4_ = auVar94._4_4_ * auVar100._4_4_;
                      auVar162._8_4_ = auVar94._8_4_ * auVar100._8_4_;
                      auVar162._12_4_ = auVar94._12_4_ * auVar100._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar162,auVar91,auVar93);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar265;
                        uVar5 = vextractps_avx(auVar91,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar5;
                        uVar5 = vextractps_avx(auVar91,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar5;
                        *(int *)(ray + k * 4 + 0x380) = auVar91._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar240;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar7;
                        *(uint *)(ray + k * 4 + 0x480) = uVar83;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar93 = ZEXT416((uint)fVar240);
                        local_340 = vbroadcastss_avx512f(auVar93);
                        auVar177 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar177 = vpermps_avx512f(auVar177,ZEXT1664(auVar91));
                        auVar287 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar287,ZEXT1664(auVar91));
                        local_380 = vbroadcastss_avx512f(auVar91);
                        local_400[0] = (RTCHitN)auVar177[0];
                        local_400[1] = (RTCHitN)auVar177[1];
                        local_400[2] = (RTCHitN)auVar177[2];
                        local_400[3] = (RTCHitN)auVar177[3];
                        local_400[4] = (RTCHitN)auVar177[4];
                        local_400[5] = (RTCHitN)auVar177[5];
                        local_400[6] = (RTCHitN)auVar177[6];
                        local_400[7] = (RTCHitN)auVar177[7];
                        local_400[8] = (RTCHitN)auVar177[8];
                        local_400[9] = (RTCHitN)auVar177[9];
                        local_400[10] = (RTCHitN)auVar177[10];
                        local_400[0xb] = (RTCHitN)auVar177[0xb];
                        local_400[0xc] = (RTCHitN)auVar177[0xc];
                        local_400[0xd] = (RTCHitN)auVar177[0xd];
                        local_400[0xe] = (RTCHitN)auVar177[0xe];
                        local_400[0xf] = (RTCHitN)auVar177[0xf];
                        local_400[0x10] = (RTCHitN)auVar177[0x10];
                        local_400[0x11] = (RTCHitN)auVar177[0x11];
                        local_400[0x12] = (RTCHitN)auVar177[0x12];
                        local_400[0x13] = (RTCHitN)auVar177[0x13];
                        local_400[0x14] = (RTCHitN)auVar177[0x14];
                        local_400[0x15] = (RTCHitN)auVar177[0x15];
                        local_400[0x16] = (RTCHitN)auVar177[0x16];
                        local_400[0x17] = (RTCHitN)auVar177[0x17];
                        local_400[0x18] = (RTCHitN)auVar177[0x18];
                        local_400[0x19] = (RTCHitN)auVar177[0x19];
                        local_400[0x1a] = (RTCHitN)auVar177[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar177[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar177[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar177[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar177[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar177[0x1f];
                        local_400[0x20] = (RTCHitN)auVar177[0x20];
                        local_400[0x21] = (RTCHitN)auVar177[0x21];
                        local_400[0x22] = (RTCHitN)auVar177[0x22];
                        local_400[0x23] = (RTCHitN)auVar177[0x23];
                        local_400[0x24] = (RTCHitN)auVar177[0x24];
                        local_400[0x25] = (RTCHitN)auVar177[0x25];
                        local_400[0x26] = (RTCHitN)auVar177[0x26];
                        local_400[0x27] = (RTCHitN)auVar177[0x27];
                        local_400[0x28] = (RTCHitN)auVar177[0x28];
                        local_400[0x29] = (RTCHitN)auVar177[0x29];
                        local_400[0x2a] = (RTCHitN)auVar177[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar177[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar177[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar177[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar177[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar177[0x2f];
                        local_400[0x30] = (RTCHitN)auVar177[0x30];
                        local_400[0x31] = (RTCHitN)auVar177[0x31];
                        local_400[0x32] = (RTCHitN)auVar177[0x32];
                        local_400[0x33] = (RTCHitN)auVar177[0x33];
                        local_400[0x34] = (RTCHitN)auVar177[0x34];
                        local_400[0x35] = (RTCHitN)auVar177[0x35];
                        local_400[0x36] = (RTCHitN)auVar177[0x36];
                        local_400[0x37] = (RTCHitN)auVar177[0x37];
                        local_400[0x38] = (RTCHitN)auVar177[0x38];
                        local_400[0x39] = (RTCHitN)auVar177[0x39];
                        local_400[0x3a] = (RTCHitN)auVar177[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar177[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar177[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar177[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar177[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar177[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar177 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar177);
                        auVar102 = vpcmpeqd_avx2(auVar177._0_32_,auVar177._0_32_);
                        local_ac8[3] = auVar102;
                        local_ac8[2] = auVar102;
                        local_ac8[1] = auVar102;
                        *local_ac8 = auVar102;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar10->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar10->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar265;
                        local_8c0 = local_4c0;
                        local_b50.valid = (int *)local_8c0;
                        local_b50.geometryUserPtr = pGVar8->userPtr;
                        local_b50.context = context->user;
                        local_b50.hit = local_400;
                        local_b50.N = 0x10;
                        local_b50.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar282 = ZEXT1664(auVar92);
                          auVar283 = ZEXT1664(auVar89);
                          auVar285 = ZEXT1664(auVar87);
                          (*pGVar8->intersectionFilterN)(&local_b50);
                          auVar263 = ZEXT1664(ZEXT416((uint)fVar265));
                          auVar272 = ZEXT1664(auVar93);
                          auVar286 = ZEXT3264(local_aa0);
                          auVar276 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar177 = vmovdqa64_avx512f(local_8c0);
                        uVar26 = vptestmd_avx512f(auVar177,auVar177);
                        if ((short)uVar26 != 0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar282 = ZEXT1664(auVar282._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            (*p_Var9)(&local_b50);
                            auVar263 = ZEXT1664(ZEXT416((uint)fVar265));
                            auVar272 = ZEXT1664(auVar93);
                            auVar286 = ZEXT3264(local_aa0);
                            auVar276 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar177 = vmovdqa64_avx512f(local_8c0);
                          uVar86 = vptestmd_avx512f(auVar177,auVar177);
                          if ((short)uVar86 != 0) {
                            iVar3 = *(int *)(local_b50.hit + 4);
                            iVar4 = *(int *)(local_b50.hit + 8);
                            iVar1 = *(int *)(local_b50.hit + 0xc);
                            iVar57 = *(int *)(local_b50.hit + 0x10);
                            iVar58 = *(int *)(local_b50.hit + 0x14);
                            iVar59 = *(int *)(local_b50.hit + 0x18);
                            iVar60 = *(int *)(local_b50.hit + 0x1c);
                            iVar61 = *(int *)(local_b50.hit + 0x20);
                            iVar62 = *(int *)(local_b50.hit + 0x24);
                            iVar63 = *(int *)(local_b50.hit + 0x28);
                            iVar64 = *(int *)(local_b50.hit + 0x2c);
                            iVar65 = *(int *)(local_b50.hit + 0x30);
                            iVar66 = *(int *)(local_b50.hit + 0x34);
                            iVar67 = *(int *)(local_b50.hit + 0x38);
                            iVar68 = *(int *)(local_b50.hit + 0x3c);
                            bVar76 = (byte)uVar86;
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar75 = (byte)(uVar86 >> 8);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x300) =
                                 (uint)(bVar76 & 1) * *(int *)local_b50.hit |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x300);
                            *(uint *)(local_b50.ray + 0x304) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x304);
                            *(uint *)(local_b50.ray + 0x308) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x308);
                            *(uint *)(local_b50.ray + 0x30c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x30c);
                            *(uint *)(local_b50.ray + 0x310) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x310);
                            *(uint *)(local_b50.ray + 0x314) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x314);
                            *(uint *)(local_b50.ray + 0x318) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x318);
                            *(uint *)(local_b50.ray + 0x31c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x31c);
                            *(uint *)(local_b50.ray + 800) =
                                 (uint)(bVar75 & 1) * iVar61 |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b50.ray + 800);
                            *(uint *)(local_b50.ray + 0x324) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x324);
                            *(uint *)(local_b50.ray + 0x328) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x328);
                            *(uint *)(local_b50.ray + 0x32c) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x32c);
                            *(uint *)(local_b50.ray + 0x330) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x330);
                            *(uint *)(local_b50.ray + 0x334) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x334);
                            *(uint *)(local_b50.ray + 0x338) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x338);
                            *(uint *)(local_b50.ray + 0x33c) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x33c);
                            iVar3 = *(int *)(local_b50.hit + 0x44);
                            iVar4 = *(int *)(local_b50.hit + 0x48);
                            iVar1 = *(int *)(local_b50.hit + 0x4c);
                            iVar57 = *(int *)(local_b50.hit + 0x50);
                            iVar58 = *(int *)(local_b50.hit + 0x54);
                            iVar59 = *(int *)(local_b50.hit + 0x58);
                            iVar60 = *(int *)(local_b50.hit + 0x5c);
                            iVar61 = *(int *)(local_b50.hit + 0x60);
                            iVar62 = *(int *)(local_b50.hit + 100);
                            iVar63 = *(int *)(local_b50.hit + 0x68);
                            iVar64 = *(int *)(local_b50.hit + 0x6c);
                            iVar65 = *(int *)(local_b50.hit + 0x70);
                            iVar66 = *(int *)(local_b50.hit + 0x74);
                            iVar67 = *(int *)(local_b50.hit + 0x78);
                            iVar68 = *(int *)(local_b50.hit + 0x7c);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x340) =
                                 (uint)(bVar76 & 1) * *(int *)(local_b50.hit + 0x40) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x340);
                            *(uint *)(local_b50.ray + 0x344) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x344);
                            *(uint *)(local_b50.ray + 0x348) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x348);
                            *(uint *)(local_b50.ray + 0x34c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x34c);
                            *(uint *)(local_b50.ray + 0x350) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x350);
                            *(uint *)(local_b50.ray + 0x354) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x354);
                            *(uint *)(local_b50.ray + 0x358) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x358);
                            *(uint *)(local_b50.ray + 0x35c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x35c);
                            *(uint *)(local_b50.ray + 0x360) =
                                 (uint)(bVar75 & 1) * iVar61 |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b50.ray + 0x360);
                            *(uint *)(local_b50.ray + 0x364) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x364);
                            *(uint *)(local_b50.ray + 0x368) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x368);
                            *(uint *)(local_b50.ray + 0x36c) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x36c);
                            *(uint *)(local_b50.ray + 0x370) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x370);
                            *(uint *)(local_b50.ray + 0x374) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x374);
                            *(uint *)(local_b50.ray + 0x378) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x378);
                            *(uint *)(local_b50.ray + 0x37c) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x37c);
                            iVar3 = *(int *)(local_b50.hit + 0x84);
                            iVar4 = *(int *)(local_b50.hit + 0x88);
                            iVar1 = *(int *)(local_b50.hit + 0x8c);
                            iVar57 = *(int *)(local_b50.hit + 0x90);
                            iVar58 = *(int *)(local_b50.hit + 0x94);
                            iVar59 = *(int *)(local_b50.hit + 0x98);
                            iVar60 = *(int *)(local_b50.hit + 0x9c);
                            iVar61 = *(int *)(local_b50.hit + 0xa0);
                            iVar62 = *(int *)(local_b50.hit + 0xa4);
                            iVar63 = *(int *)(local_b50.hit + 0xa8);
                            iVar64 = *(int *)(local_b50.hit + 0xac);
                            iVar65 = *(int *)(local_b50.hit + 0xb0);
                            iVar66 = *(int *)(local_b50.hit + 0xb4);
                            iVar67 = *(int *)(local_b50.hit + 0xb8);
                            iVar68 = *(int *)(local_b50.hit + 0xbc);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x380) =
                                 (uint)(bVar76 & 1) * *(int *)(local_b50.hit + 0x80) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x380);
                            *(uint *)(local_b50.ray + 900) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 900);
                            *(uint *)(local_b50.ray + 0x388) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x388);
                            *(uint *)(local_b50.ray + 0x38c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x38c);
                            *(uint *)(local_b50.ray + 0x390) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x390);
                            *(uint *)(local_b50.ray + 0x394) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x394);
                            *(uint *)(local_b50.ray + 0x398) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x398);
                            *(uint *)(local_b50.ray + 0x39c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x39c);
                            *(uint *)(local_b50.ray + 0x3a0) =
                                 (uint)(bVar75 & 1) * iVar61 |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b50.ray + 0x3a0);
                            *(uint *)(local_b50.ray + 0x3a4) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x3a4);
                            *(uint *)(local_b50.ray + 0x3a8) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x3a8);
                            *(uint *)(local_b50.ray + 0x3ac) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ac);
                            *(uint *)(local_b50.ray + 0x3b0) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x3b0);
                            *(uint *)(local_b50.ray + 0x3b4) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x3b4);
                            *(uint *)(local_b50.ray + 0x3b8) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x3b8);
                            *(uint *)(local_b50.ray + 0x3bc) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x3bc);
                            iVar3 = *(int *)(local_b50.hit + 0xc4);
                            iVar4 = *(int *)(local_b50.hit + 200);
                            iVar1 = *(int *)(local_b50.hit + 0xcc);
                            iVar57 = *(int *)(local_b50.hit + 0xd0);
                            iVar58 = *(int *)(local_b50.hit + 0xd4);
                            iVar59 = *(int *)(local_b50.hit + 0xd8);
                            iVar60 = *(int *)(local_b50.hit + 0xdc);
                            iVar61 = *(int *)(local_b50.hit + 0xe0);
                            iVar62 = *(int *)(local_b50.hit + 0xe4);
                            iVar63 = *(int *)(local_b50.hit + 0xe8);
                            iVar64 = *(int *)(local_b50.hit + 0xec);
                            iVar65 = *(int *)(local_b50.hit + 0xf0);
                            iVar66 = *(int *)(local_b50.hit + 0xf4);
                            iVar67 = *(int *)(local_b50.hit + 0xf8);
                            iVar68 = *(int *)(local_b50.hit + 0xfc);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x3c0) =
                                 (uint)(bVar76 & 1) * *(int *)(local_b50.hit + 0xc0) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x3c0);
                            *(uint *)(local_b50.ray + 0x3c4) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x3c4);
                            *(uint *)(local_b50.ray + 0x3c8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x3c8);
                            *(uint *)(local_b50.ray + 0x3cc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x3cc);
                            *(uint *)(local_b50.ray + 0x3d0) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x3d0);
                            *(uint *)(local_b50.ray + 0x3d4) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x3d4);
                            *(uint *)(local_b50.ray + 0x3d8) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x3d8);
                            *(uint *)(local_b50.ray + 0x3dc) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x3dc);
                            *(uint *)(local_b50.ray + 0x3e0) =
                                 (uint)(bVar75 & 1) * iVar61 |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b50.ray + 0x3e0);
                            *(uint *)(local_b50.ray + 0x3e4) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x3e4);
                            *(uint *)(local_b50.ray + 1000) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 1000);
                            *(uint *)(local_b50.ray + 0x3ec) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ec);
                            *(uint *)(local_b50.ray + 0x3f0) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x3f0);
                            *(uint *)(local_b50.ray + 0x3f4) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x3f4);
                            *(uint *)(local_b50.ray + 0x3f8) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x3f8);
                            *(uint *)(local_b50.ray + 0x3fc) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x3fc);
                            iVar3 = *(int *)(local_b50.hit + 0x104);
                            iVar4 = *(int *)(local_b50.hit + 0x108);
                            iVar1 = *(int *)(local_b50.hit + 0x10c);
                            iVar57 = *(int *)(local_b50.hit + 0x110);
                            iVar58 = *(int *)(local_b50.hit + 0x114);
                            iVar59 = *(int *)(local_b50.hit + 0x118);
                            iVar60 = *(int *)(local_b50.hit + 0x11c);
                            iVar61 = *(int *)(local_b50.hit + 0x120);
                            iVar62 = *(int *)(local_b50.hit + 0x124);
                            iVar63 = *(int *)(local_b50.hit + 0x128);
                            iVar64 = *(int *)(local_b50.hit + 300);
                            iVar65 = *(int *)(local_b50.hit + 0x130);
                            iVar66 = *(int *)(local_b50.hit + 0x134);
                            iVar67 = *(int *)(local_b50.hit + 0x138);
                            iVar68 = *(int *)(local_b50.hit + 0x13c);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x400) =
                                 (uint)(bVar76 & 1) * *(int *)(local_b50.hit + 0x100) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x400);
                            *(uint *)(local_b50.ray + 0x404) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x404);
                            *(uint *)(local_b50.ray + 0x408) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x408);
                            *(uint *)(local_b50.ray + 0x40c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x40c);
                            *(uint *)(local_b50.ray + 0x410) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x410);
                            *(uint *)(local_b50.ray + 0x414) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x414);
                            *(uint *)(local_b50.ray + 0x418) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x418);
                            *(uint *)(local_b50.ray + 0x41c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x41c);
                            *(uint *)(local_b50.ray + 0x420) =
                                 (uint)(bVar75 & 1) * iVar61 |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b50.ray + 0x420);
                            *(uint *)(local_b50.ray + 0x424) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x424);
                            *(uint *)(local_b50.ray + 0x428) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x428);
                            *(uint *)(local_b50.ray + 0x42c) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x42c);
                            *(uint *)(local_b50.ray + 0x430) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x430);
                            *(uint *)(local_b50.ray + 0x434) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x434);
                            *(uint *)(local_b50.ray + 0x438) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x438);
                            *(uint *)(local_b50.ray + 0x43c) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x43c);
                            auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x140));
                            auVar177 = vmovdqu32_avx512f(auVar177);
                            *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar177;
                            auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x180));
                            auVar177 = vmovdqu32_avx512f(auVar177);
                            *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar177;
                            auVar287 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x1c0));
                            auVar177 = vmovdqa32_avx512f(auVar287);
                            *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar177;
                            auVar143 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x200));
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            auVar52._4_56_ = auVar143._8_56_;
                            auVar52._0_4_ =
                                 (uint)bVar85 * auVar143._4_4_ | (uint)!bVar85 * auVar287._4_4_;
                            auVar177._0_8_ = auVar52._0_8_ << 0x20;
                            bVar85 = (bool)((byte)(uVar86 >> 2) & 1);
                            auVar177._8_4_ =
                                 (uint)bVar85 * auVar143._8_4_ | (uint)!bVar85 * auVar287._8_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 3) & 1);
                            auVar177._12_4_ =
                                 (uint)bVar85 * auVar143._12_4_ | (uint)!bVar85 * auVar287._12_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 4) & 1);
                            auVar177._16_4_ =
                                 (uint)bVar85 * auVar143._16_4_ | (uint)!bVar85 * auVar287._16_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 5) & 1);
                            auVar177._20_4_ =
                                 (uint)bVar85 * auVar143._20_4_ | (uint)!bVar85 * auVar287._20_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 6) & 1);
                            auVar177._24_4_ =
                                 (uint)bVar85 * auVar143._24_4_ | (uint)!bVar85 * auVar287._24_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 7) & 1);
                            auVar177._28_4_ =
                                 (uint)bVar85 * auVar143._28_4_ | (uint)!bVar85 * auVar287._28_4_;
                            auVar177._32_4_ =
                                 (uint)(bVar75 & 1) * auVar143._32_4_ |
                                 (uint)!(bool)(bVar75 & 1) * auVar287._32_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 9) & 1);
                            auVar177._36_4_ =
                                 (uint)bVar85 * auVar143._36_4_ | (uint)!bVar85 * auVar287._36_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 10) & 1);
                            auVar177._40_4_ =
                                 (uint)bVar85 * auVar143._40_4_ | (uint)!bVar85 * auVar287._40_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            auVar177._44_4_ =
                                 (uint)bVar85 * auVar143._44_4_ | (uint)!bVar85 * auVar287._44_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            auVar177._48_4_ =
                                 (uint)bVar85 * auVar143._48_4_ | (uint)!bVar85 * auVar287._48_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            auVar177._52_4_ =
                                 (uint)bVar85 * auVar143._52_4_ | (uint)!bVar85 * auVar287._52_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            auVar177._56_4_ =
                                 (uint)bVar85 * auVar143._56_4_ | (uint)!bVar85 * auVar287._56_4_;
                            bVar85 = SUB81(uVar86 >> 0xf,0);
                            auVar177._60_4_ =
                                 (uint)bVar85 * auVar143._60_4_ | (uint)!bVar85 * auVar287._60_4_;
                            auVar287 = vmovdqa32_avx512f(auVar143);
                            *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar287;
                            goto LAB_01b59a63;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar250;
                      }
                    }
                  }
                }
LAB_01b59a63:
                auVar102 = auVar177._32_32_;
                bVar85 = lVar84 != 0;
                lVar84 = lVar84 + -1;
              } while ((!bVar11) && (bVar85));
              auVar69._4_4_ = fStack_85c;
              auVar69._0_4_ = local_860;
              auVar69._8_4_ = fStack_858;
              auVar69._12_4_ = fStack_854;
              auVar69._16_4_ = fStack_850;
              auVar69._20_4_ = fStack_84c;
              auVar69._24_4_ = fStack_848;
              auVar69._28_4_ = fStack_844;
              uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar40._4_4_ = uVar5;
              auVar40._0_4_ = uVar5;
              auVar40._8_4_ = uVar5;
              auVar40._12_4_ = uVar5;
              auVar40._16_4_ = uVar5;
              auVar40._20_4_ = uVar5;
              auVar40._24_4_ = uVar5;
              auVar40._28_4_ = uVar5;
              uVar26 = vcmpps_avx512vl(auVar69,auVar40,2);
              bVar80 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar80 & (byte)uVar26;
            } while (bVar80 != 0);
          }
          auVar173._0_4_ = (float)local_880._0_4_ + (float)local_940._0_4_;
          auVar173._4_4_ = (float)local_880._4_4_ + (float)local_940._4_4_;
          auVar173._8_4_ = fStack_878 + fStack_938;
          auVar173._12_4_ = fStack_874 + fStack_934;
          auVar173._16_4_ = fStack_870 + fStack_930;
          auVar173._20_4_ = fStack_86c + fStack_92c;
          auVar173._24_4_ = fStack_868 + fStack_928;
          auVar173._28_4_ = fStack_864 + fStack_924;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar41._4_4_ = uVar5;
          auVar41._0_4_ = uVar5;
          auVar41._8_4_ = uVar5;
          auVar41._12_4_ = uVar5;
          auVar41._16_4_ = uVar5;
          auVar41._20_4_ = uVar5;
          auVar41._24_4_ = uVar5;
          auVar41._28_4_ = uVar5;
          uVar26 = vcmpps_avx512vl(auVar173,auVar41,2);
          bVar81 = (byte)uVar25 | ~bVar81;
          bVar74 = (byte)uVar27 & bVar74 & (byte)uVar26;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar42._8_4_ = 3;
          auVar42._0_8_ = 0x300000003;
          auVar42._12_4_ = 3;
          auVar42._16_4_ = 3;
          auVar42._20_4_ = 3;
          auVar42._24_4_ = 3;
          auVar42._28_4_ = 3;
          auVar104 = vpblendmd_avx512vl(auVar174,auVar42);
          local_880._0_4_ = (uint)(bVar81 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar81 & 1) * 2;
          bVar11 = (bool)(bVar81 >> 1 & 1);
          local_880._4_4_ = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar81 >> 2 & 1);
          fStack_878 = (float)((uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar81 >> 3 & 1);
          fStack_874 = (float)((uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar81 >> 4 & 1);
          fStack_870 = (float)((uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar81 >> 5 & 1);
          fStack_86c = (float)((uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar81 >> 6 & 1);
          fStack_868 = (float)((uint)bVar11 * auVar104._24_4_ | (uint)!bVar11 * 2);
          fStack_864 = (float)((uint)(bVar81 >> 7) * auVar104._28_4_ |
                              (uint)!(bool)(bVar81 >> 7) * 2);
          auVar150._32_32_ = auVar102;
          auVar150._0_32_ = _local_880;
          uVar25 = vpcmpd_avx512vl(_local_880,local_7e0,2);
          bVar81 = (byte)uVar25 & bVar74;
          if (bVar81 != 0) {
            auVar93 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar91 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar92 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar100 = vminps_avx(auVar93,auVar92);
            auVar93 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar92 = vmaxps_avx(auVar91,auVar93);
            auVar91 = vandps_avx(auVar276._0_16_,auVar100);
            auVar93 = vandps_avx(auVar276._0_16_,auVar92);
            auVar91 = vmaxps_avx(auVar91,auVar93);
            auVar93 = vmovshdup_avx(auVar91);
            auVar93 = vmaxss_avx(auVar93,auVar91);
            auVar91 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vmaxss_avx(auVar91,auVar93);
            fVar261 = auVar91._0_4_ * 1.9073486e-06;
            local_9d0 = vshufps_avx(auVar92,auVar92,0xff);
            _local_960 = _local_780;
            local_860 = (float)local_780._0_4_ + (float)local_940._0_4_;
            fStack_85c = (float)local_780._4_4_ + (float)local_940._4_4_;
            fStack_858 = fStack_778 + fStack_938;
            fStack_854 = fStack_774 + fStack_934;
            fStack_850 = fStack_770 + fStack_930;
            fStack_84c = fStack_76c + fStack_92c;
            fStack_848 = fStack_768 + fStack_928;
            fStack_844 = fStack_764 + fStack_924;
            do {
              auVar175._8_4_ = 0x7f800000;
              auVar175._0_8_ = 0x7f8000007f800000;
              auVar175._12_4_ = 0x7f800000;
              auVar175._16_4_ = 0x7f800000;
              auVar175._20_4_ = 0x7f800000;
              auVar175._24_4_ = 0x7f800000;
              auVar175._28_4_ = 0x7f800000;
              auVar102 = vblendmps_avx512vl(auVar175,_local_960);
              auVar141._0_4_ =
                   (uint)(bVar81 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar81 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar81 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar81 >> 3 & 1);
              auVar141._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar81 >> 4 & 1);
              auVar141._16_4_ = (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar81 >> 5 & 1);
              auVar141._20_4_ = (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar141._24_4_ =
                   (uint)(bVar81 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar81 >> 6) * 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar150._0_32_ = auVar141;
              auVar102 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar102 = vminps_avx(auVar141,auVar102);
              auVar104 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar104);
              auVar104 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar104);
              uVar25 = vcmpps_avx512vl(auVar141,auVar102,0);
              bVar76 = (byte)uVar25 & bVar81;
              bVar80 = bVar81;
              if (bVar76 != 0) {
                bVar80 = bVar76;
              }
              iVar2 = 0;
              for (uVar79 = (uint)bVar80; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar79 = *(uint *)(local_840 + (uint)(iVar2 << 2));
              fVar264 = *(float *)(local_760 + (uint)(iVar2 << 2));
              fVar265 = auVar90._0_4_;
              if ((float)local_a80._0_4_ < 0.0) {
                fVar265 = sqrtf((float)local_a80._0_4_);
              }
              auVar177 = ZEXT464(uVar79);
              lVar84 = 4;
              do {
                auVar102 = auVar150._32_32_;
                auVar163._4_4_ = fVar264;
                auVar163._0_4_ = fVar264;
                auVar163._8_4_ = fVar264;
                auVar163._12_4_ = fVar264;
                auVar91 = vfmadd132ps_fma(auVar163,ZEXT816(0) << 0x40,local_a70);
                fVar240 = auVar177._0_4_;
                fVar239 = 1.0 - fVar240;
                auVar95 = SUB6416(ZEXT464(0x40400000),0);
                auVar94 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar268 = auVar177._0_16_;
                auVar92 = vfmadd213ss_fma(auVar95,auVar268,auVar94);
                auVar93 = vfmadd213ss_fma(auVar92,ZEXT416((uint)(fVar240 * fVar240)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar100 = vfmadd213ss_fma(auVar95,ZEXT416((uint)fVar239),auVar94);
                auVar100 = vfmadd213ss_fma(auVar100,ZEXT416((uint)(fVar239 * fVar239)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar266 = fVar239 * fVar239 * -fVar240 * 0.5;
                fVar250 = auVar93._0_4_ * 0.5;
                fVar235 = auVar100._0_4_ * 0.5;
                fVar238 = fVar240 * fVar240 * -fVar239 * 0.5;
                auVar218._0_4_ = fVar238 * (float)local_a60._0_4_;
                auVar218._4_4_ = fVar238 * (float)local_a60._4_4_;
                auVar218._8_4_ = fVar238 * fStack_a58;
                auVar218._12_4_ = fVar238 * fStack_a54;
                auVar229._4_4_ = fVar235;
                auVar229._0_4_ = fVar235;
                auVar229._8_4_ = fVar235;
                auVar229._12_4_ = fVar235;
                auVar93 = vfmadd132ps_fma(auVar229,auVar218,local_a20._0_16_);
                auVar206._4_4_ = fVar250;
                auVar206._0_4_ = fVar250;
                auVar206._8_4_ = fVar250;
                auVar206._12_4_ = fVar250;
                auVar93 = vfmadd132ps_fma(auVar206,auVar93,local_a40._0_16_);
                auVar219._4_4_ = fVar266;
                auVar219._0_4_ = fVar266;
                auVar219._8_4_ = fVar266;
                auVar219._12_4_ = fVar266;
                auVar93 = vfmadd132ps_fma(auVar219,auVar93,local_a00._0_16_);
                auVar100 = vfmadd231ss_fma(auVar94,auVar268,ZEXT416(0x41100000));
                local_900._0_16_ = auVar100;
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar268,
                                           ZEXT416(0x40800000));
                local_920._0_16_ = auVar100;
                local_990 = vfmadd213ss_fma(auVar95,auVar268,ZEXT416(0xbf800000));
                local_8e0._0_16_ = auVar93;
                auVar93 = vsubps_avx(auVar91,auVar93);
                auVar91 = vdpps_avx(auVar93,auVar93,0x7f);
                fVar266 = auVar91._0_4_;
                if (fVar266 < 0.0) {
                  local_b00._0_4_ = auVar92._0_4_;
                  local_b20._0_16_ = ZEXT416((uint)fVar239);
                  auVar285._0_4_ = sqrtf(fVar266);
                  auVar285._4_60_ = extraout_var_01;
                  auVar92 = ZEXT416((uint)local_b00._0_4_);
                  auVar100 = auVar285._0_16_;
                  auVar94 = local_b20._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar91,auVar91);
                  auVar94 = ZEXT416((uint)fVar239);
                }
                fVar250 = auVar94._0_4_;
                auVar89 = vfnmadd231ss_fma(ZEXT416((uint)(fVar240 * (fVar250 + fVar250))),auVar94,
                                           auVar94);
                auVar92 = vfmadd213ss_fma(auVar92,ZEXT416((uint)(fVar240 + fVar240)),
                                          ZEXT416((uint)(fVar240 * fVar240 * 3.0)));
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar268,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar250 * -3.0)),
                                          ZEXT416((uint)(fVar250 + fVar250)),auVar94);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar239 * -2.0)),auVar268,
                                          ZEXT416((uint)(fVar240 * fVar240)));
                fVar250 = auVar89._0_4_ * 0.5;
                fVar235 = auVar92._0_4_ * 0.5;
                fVar238 = auVar95._0_4_ * 0.5;
                fVar239 = auVar94._0_4_ * 0.5;
                auVar220._0_4_ = fVar239 * (float)local_a60._0_4_;
                auVar220._4_4_ = fVar239 * (float)local_a60._4_4_;
                auVar220._8_4_ = fVar239 * fStack_a58;
                auVar220._12_4_ = fVar239 * fStack_a54;
                auVar207._4_4_ = fVar238;
                auVar207._0_4_ = fVar238;
                auVar207._8_4_ = fVar238;
                auVar207._12_4_ = fVar238;
                auVar92 = vfmadd132ps_fma(auVar207,auVar220,local_a20._0_16_);
                auVar187._4_4_ = fVar235;
                auVar187._0_4_ = fVar235;
                auVar187._8_4_ = fVar235;
                auVar187._12_4_ = fVar235;
                auVar92 = vfmadd132ps_fma(auVar187,auVar92,local_a40._0_16_);
                auVar281._4_4_ = fVar250;
                auVar281._0_4_ = fVar250;
                auVar281._8_4_ = fVar250;
                auVar281._12_4_ = fVar250;
                local_b00._0_16_ = vfmadd132ps_fma(auVar281,auVar92,local_a00._0_16_);
                auVar92 = vdpps_avx(local_b00._0_16_,local_b00._0_16_,0x7f);
                auVar56._12_4_ = 0;
                auVar56._0_12_ = ZEXT812(0);
                fVar250 = auVar92._0_4_;
                auVar94 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar250));
                fVar235 = auVar94._0_4_;
                auVar95 = vrcp14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar250));
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar89 = vxorps_avx512vl(auVar92,auVar31);
                auVar94 = vfnmadd213ss_fma(auVar95,auVar92,SUB6416(ZEXT464(0x40000000),0));
                local_b20._0_4_ = auVar100._0_4_;
                if (fVar250 < auVar89._0_4_) {
                  auVar286._0_4_ = sqrtf(fVar250);
                  auVar286._4_60_ = extraout_var_02;
                  auVar100 = ZEXT416((uint)local_b20._0_4_);
                  auVar89 = auVar286._0_16_;
                  auVar92 = local_b00._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx512f(auVar92,auVar92);
                  auVar92 = local_b00._0_16_;
                }
                fVar235 = fVar235 * 1.5 + fVar250 * -0.5 * fVar235 * fVar235 * fVar235;
                auVar164._0_4_ = auVar92._0_4_ * fVar235;
                auVar164._4_4_ = auVar92._4_4_ * fVar235;
                auVar164._8_4_ = auVar92._8_4_ * fVar235;
                auVar164._12_4_ = auVar92._12_4_ * fVar235;
                auVar87 = vdpps_avx(auVar93,auVar164,0x7f);
                fVar241 = auVar100._0_4_;
                fVar238 = auVar87._0_4_;
                auVar165._0_4_ = fVar238 * fVar238;
                auVar165._4_4_ = auVar87._4_4_ * auVar87._4_4_;
                auVar165._8_4_ = auVar87._8_4_ * auVar87._8_4_;
                auVar165._12_4_ = auVar87._12_4_ * auVar87._12_4_;
                auVar96 = vsubps_avx512vl(auVar91,auVar165);
                fVar239 = auVar96._0_4_;
                auVar188._4_12_ = ZEXT812(0) << 0x20;
                auVar188._0_4_ = fVar239;
                auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                auVar98 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
                auVar99 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
                if (fVar239 < 0.0) {
                  local_9b0 = fVar235;
                  fStack_9ac = fVar235;
                  fStack_9a8 = fVar235;
                  fStack_9a4 = fVar235;
                  local_9a0 = auVar97;
                  fVar239 = sqrtf(fVar239);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar98 = ZEXT416(auVar98._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar100 = ZEXT416((uint)local_b20._0_4_);
                  auVar92 = local_b00._0_16_;
                  auVar97 = local_9a0;
                  fVar235 = local_9b0;
                  fVar242 = fStack_9ac;
                  fVar243 = fStack_9a8;
                  fVar251 = fStack_9a4;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  fVar239 = auVar96._0_4_;
                  fVar242 = fVar235;
                  fVar243 = fVar235;
                  fVar251 = fVar235;
                }
                auVar285 = ZEXT1664(auVar87);
                auVar282 = ZEXT1664(auVar92);
                auVar276 = ZEXT1664(auVar93);
                auVar262._8_4_ = 0x7fffffff;
                auVar262._0_8_ = 0x7fffffff7fffffff;
                auVar262._12_4_ = 0x7fffffff;
                auVar263 = ZEXT1664(auVar262);
                auVar147._32_32_ = auVar102;
                auVar147._0_32_ = local_aa0;
                auVar286 = ZEXT3264(local_aa0);
                auVar189._0_4_ = (float)local_990._0_4_ * (float)local_a60._0_4_;
                auVar189._4_4_ = (float)local_990._0_4_ * (float)local_a60._4_4_;
                auVar189._8_4_ = (float)local_990._0_4_ * fStack_a58;
                auVar189._12_4_ = (float)local_990._0_4_ * fStack_a54;
                auVar208._4_4_ = local_920._0_4_;
                auVar208._0_4_ = local_920._0_4_;
                auVar208._8_4_ = local_920._0_4_;
                auVar208._12_4_ = local_920._0_4_;
                auVar96 = vfmadd132ps_fma(auVar208,auVar189,local_a20._0_16_);
                auVar190._4_4_ = local_900._0_4_;
                auVar190._0_4_ = local_900._0_4_;
                auVar190._8_4_ = local_900._0_4_;
                auVar190._12_4_ = local_900._0_4_;
                auVar96 = vfmadd132ps_fma(auVar190,auVar96,local_a40._0_16_);
                auVar268 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar268,
                                           ZEXT416(0x40000000));
                auVar209._0_4_ = auVar268._0_4_;
                auVar209._4_4_ = auVar209._0_4_;
                auVar209._8_4_ = auVar209._0_4_;
                auVar209._12_4_ = auVar209._0_4_;
                auVar268 = vfmadd132ps_fma(auVar209,auVar96,local_a00._0_16_);
                auVar191._0_4_ = auVar268._0_4_ * fVar250;
                auVar191._4_4_ = auVar268._4_4_ * fVar250;
                auVar191._8_4_ = auVar268._8_4_ * fVar250;
                auVar191._12_4_ = auVar268._12_4_ * fVar250;
                auVar268 = vdpps_avx(auVar92,auVar268,0x7f);
                fVar250 = auVar268._0_4_;
                auVar210._0_4_ = auVar92._0_4_ * fVar250;
                auVar210._4_4_ = auVar92._4_4_ * fVar250;
                auVar210._8_4_ = auVar92._8_4_ * fVar250;
                auVar210._12_4_ = auVar92._12_4_ * fVar250;
                auVar268 = vsubps_avx(auVar191,auVar210);
                local_be0 = auVar95._0_4_;
                local_be0 = auVar94._0_4_ * local_be0;
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar150._16_48_ = auVar147._16_48_;
                auVar96 = vxorps_avx512vl(auVar92,auVar32);
                auVar230._0_4_ = fVar235 * auVar268._0_4_ * local_be0;
                auVar230._4_4_ = fVar242 * auVar268._4_4_ * local_be0;
                auVar230._8_4_ = fVar243 * auVar268._8_4_ * local_be0;
                auVar230._12_4_ = fVar251 * auVar268._12_4_ * local_be0;
                auVar94 = vdpps_avx(auVar96,auVar164,0x7f);
                auVar268 = vmaxss_avx(ZEXT416((uint)fVar261),
                                      ZEXT416((uint)(fVar264 * fVar265 * 1.9073486e-06)));
                auVar89 = vdivss_avx512f(ZEXT416((uint)fVar261),auVar89);
                auVar95 = vdpps_avx(auVar93,auVar230,0x7f);
                auVar100 = vfmadd213ss_fma(auVar100,ZEXT416((uint)fVar261),auVar268);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),auVar89,auVar100);
                auVar283 = ZEXT1664(auVar89);
                auVar100 = vdpps_avx(local_a70,auVar164,0x7f);
                fVar250 = auVar94._0_4_ + auVar95._0_4_;
                auVar94 = vdpps_avx(auVar93,auVar96,0x7f);
                auVar96 = vmulss_avx512f(auVar99,auVar97);
                auVar97 = vmulss_avx512f(auVar97,auVar97);
                auVar95 = vdpps_avx(auVar93,local_a70,0x7f);
                auVar150._0_16_ =
                     vaddss_avx512f(auVar98,ZEXT416((uint)(auVar96._0_4_ * auVar97._0_4_)));
                auVar97 = vfnmadd231ss_fma(auVar94,auVar87,ZEXT416((uint)fVar250));
                auVar96 = vfnmadd231ss_fma(auVar95,auVar87,auVar100);
                auVar94 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar239 = fVar239 - auVar94._0_4_;
                auVar94 = vshufps_avx(auVar92,auVar92,0xff);
                auVar95 = vfmsub213ss_fma(auVar97,auVar150._0_16_,auVar94);
                fVar235 = auVar96._0_4_ * auVar150._0_4_;
                auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * auVar95._0_4_)),
                                          ZEXT416((uint)fVar250),ZEXT416((uint)fVar235));
                fVar241 = auVar97._0_4_;
                fVar240 = fVar240 - (fVar238 * (fVar235 / fVar241) -
                                    fVar239 * (auVar100._0_4_ / fVar241));
                auVar177 = ZEXT464((uint)fVar240);
                fVar264 = fVar264 - (fVar239 * (fVar250 / fVar241) -
                                    fVar238 * (auVar95._0_4_ / fVar241));
                auVar100 = vandps_avx(auVar87,auVar262);
                if (auVar89._0_4_ <= auVar100._0_4_) {
LAB_01b5a6ea:
                  bVar11 = false;
                }
                else {
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ + auVar268._0_4_)),
                                            local_9d0,ZEXT416(0x36000000));
                  auVar100 = vandps_avx(auVar262,ZEXT416((uint)fVar239));
                  if (auVar95._0_4_ <= auVar100._0_4_) goto LAB_01b5a6ea;
                  fVar264 = fVar264 + (float)local_9c0._0_4_;
                  bVar11 = true;
                  if ((((fVar158 <= fVar264) &&
                       (fVar250 = *(float *)(ray + k * 4 + 0x200), fVar264 <= fVar250)) &&
                      (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                    auVar149._16_48_ = auVar150._16_48_;
                    auVar149._0_16_ = ZEXT816(0) << 0x20;
                    auVar148._4_60_ = auVar149._4_60_;
                    auVar148._0_4_ = fVar266;
                    auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar148._0_16_);
                    fVar266 = auVar100._0_4_;
                    auVar150._0_16_ = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                    pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar266 = fVar266 * 1.5 + auVar150._0_4_ * fVar266 * fVar266 * fVar266;
                      auVar192._0_4_ = auVar93._0_4_ * fVar266;
                      auVar192._4_4_ = auVar93._4_4_ * fVar266;
                      auVar192._8_4_ = auVar93._8_4_ * fVar266;
                      auVar192._12_4_ = auVar93._12_4_ * fVar266;
                      auVar95 = vfmadd213ps_fma(auVar94,auVar192,auVar92);
                      auVar91 = vshufps_avx(auVar192,auVar192,0xc9);
                      auVar100 = vshufps_avx(auVar92,auVar92,0xc9);
                      auVar193._0_4_ = auVar192._0_4_ * auVar100._0_4_;
                      auVar193._4_4_ = auVar192._4_4_ * auVar100._4_4_;
                      auVar193._8_4_ = auVar192._8_4_ * auVar100._8_4_;
                      auVar193._12_4_ = auVar192._12_4_ * auVar100._12_4_;
                      auVar94 = vfmsub231ps_fma(auVar193,auVar92,auVar91);
                      auVar91 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar100 = vshufps_avx(auVar95,auVar95,0xc9);
                      auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                      auVar166._0_4_ = auVar95._0_4_ * auVar94._0_4_;
                      auVar166._4_4_ = auVar95._4_4_ * auVar94._4_4_;
                      auVar166._8_4_ = auVar95._8_4_ * auVar94._8_4_;
                      auVar166._12_4_ = auVar95._12_4_ * auVar94._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar166,auVar91,auVar100);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar264;
                        uVar5 = vextractps_avx(auVar91,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar5;
                        uVar5 = vextractps_avx(auVar91,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar5;
                        *(int *)(ray + k * 4 + 0x380) = auVar91._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar240;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar7;
                        *(uint *)(ray + k * 4 + 0x480) = uVar83;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar100 = ZEXT416((uint)fVar240);
                        local_340 = vbroadcastss_avx512f(auVar100);
                        auVar272 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar272 = vpermps_avx512f(auVar272,ZEXT1664(auVar91));
                        auVar287 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar287,ZEXT1664(auVar91));
                        local_380 = vbroadcastss_avx512f(auVar91);
                        local_400[0] = (RTCHitN)auVar272[0];
                        local_400[1] = (RTCHitN)auVar272[1];
                        local_400[2] = (RTCHitN)auVar272[2];
                        local_400[3] = (RTCHitN)auVar272[3];
                        local_400[4] = (RTCHitN)auVar272[4];
                        local_400[5] = (RTCHitN)auVar272[5];
                        local_400[6] = (RTCHitN)auVar272[6];
                        local_400[7] = (RTCHitN)auVar272[7];
                        local_400[8] = (RTCHitN)auVar272[8];
                        local_400[9] = (RTCHitN)auVar272[9];
                        local_400[10] = (RTCHitN)auVar272[10];
                        local_400[0xb] = (RTCHitN)auVar272[0xb];
                        local_400[0xc] = (RTCHitN)auVar272[0xc];
                        local_400[0xd] = (RTCHitN)auVar272[0xd];
                        local_400[0xe] = (RTCHitN)auVar272[0xe];
                        local_400[0xf] = (RTCHitN)auVar272[0xf];
                        local_400[0x10] = (RTCHitN)auVar272[0x10];
                        local_400[0x11] = (RTCHitN)auVar272[0x11];
                        local_400[0x12] = (RTCHitN)auVar272[0x12];
                        local_400[0x13] = (RTCHitN)auVar272[0x13];
                        local_400[0x14] = (RTCHitN)auVar272[0x14];
                        local_400[0x15] = (RTCHitN)auVar272[0x15];
                        local_400[0x16] = (RTCHitN)auVar272[0x16];
                        local_400[0x17] = (RTCHitN)auVar272[0x17];
                        local_400[0x18] = (RTCHitN)auVar272[0x18];
                        local_400[0x19] = (RTCHitN)auVar272[0x19];
                        local_400[0x1a] = (RTCHitN)auVar272[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar272[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar272[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar272[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar272[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar272[0x1f];
                        local_400[0x20] = (RTCHitN)auVar272[0x20];
                        local_400[0x21] = (RTCHitN)auVar272[0x21];
                        local_400[0x22] = (RTCHitN)auVar272[0x22];
                        local_400[0x23] = (RTCHitN)auVar272[0x23];
                        local_400[0x24] = (RTCHitN)auVar272[0x24];
                        local_400[0x25] = (RTCHitN)auVar272[0x25];
                        local_400[0x26] = (RTCHitN)auVar272[0x26];
                        local_400[0x27] = (RTCHitN)auVar272[0x27];
                        local_400[0x28] = (RTCHitN)auVar272[0x28];
                        local_400[0x29] = (RTCHitN)auVar272[0x29];
                        local_400[0x2a] = (RTCHitN)auVar272[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar272[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar272[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar272[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar272[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar272[0x2f];
                        local_400[0x30] = (RTCHitN)auVar272[0x30];
                        local_400[0x31] = (RTCHitN)auVar272[0x31];
                        local_400[0x32] = (RTCHitN)auVar272[0x32];
                        local_400[0x33] = (RTCHitN)auVar272[0x33];
                        local_400[0x34] = (RTCHitN)auVar272[0x34];
                        local_400[0x35] = (RTCHitN)auVar272[0x35];
                        local_400[0x36] = (RTCHitN)auVar272[0x36];
                        local_400[0x37] = (RTCHitN)auVar272[0x37];
                        local_400[0x38] = (RTCHitN)auVar272[0x38];
                        local_400[0x39] = (RTCHitN)auVar272[0x39];
                        local_400[0x3a] = (RTCHitN)auVar272[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar272[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar272[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar272[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar272[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar272[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar272 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar272);
                        auVar102 = vpcmpeqd_avx2(auVar272._0_32_,auVar272._0_32_);
                        local_ac8[3] = auVar102;
                        local_ac8[2] = auVar102;
                        local_ac8[1] = auVar102;
                        *local_ac8 = auVar102;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar10->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar10->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar264;
                        local_8c0 = local_4c0;
                        local_b50.valid = (int *)local_8c0;
                        local_b50.geometryUserPtr = pGVar8->userPtr;
                        local_b50.context = context->user;
                        local_b50.hit = local_400;
                        local_b50.N = 0x10;
                        local_b50.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar263 = ZEXT1664(auVar262);
                          auVar276 = ZEXT1664(auVar93);
                          auVar282 = ZEXT1664(auVar92);
                          auVar283 = ZEXT1664(auVar89);
                          auVar285 = ZEXT1664(auVar87);
                          (*pGVar8->intersectionFilterN)(&local_b50);
                          auVar177 = ZEXT1664(auVar100);
                          auVar286 = ZEXT3264(local_aa0);
                        }
                        auVar150 = vmovdqa64_avx512f(local_8c0);
                        uVar25 = vptestmd_avx512f(auVar150,auVar150);
                        if ((short)uVar25 != 0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar263 = ZEXT1664(auVar263._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            auVar282 = ZEXT1664(auVar282._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            (*p_Var9)(&local_b50);
                            auVar177 = ZEXT1664(auVar100);
                            auVar286 = ZEXT3264(local_aa0);
                          }
                          auVar150 = vmovdqa64_avx512f(local_8c0);
                          uVar86 = vptestmd_avx512f(auVar150,auVar150);
                          if ((short)uVar86 != 0) {
                            iVar3 = *(int *)(local_b50.hit + 4);
                            iVar4 = *(int *)(local_b50.hit + 8);
                            iVar1 = *(int *)(local_b50.hit + 0xc);
                            iVar57 = *(int *)(local_b50.hit + 0x10);
                            iVar58 = *(int *)(local_b50.hit + 0x14);
                            iVar59 = *(int *)(local_b50.hit + 0x18);
                            iVar60 = *(int *)(local_b50.hit + 0x1c);
                            iVar61 = *(int *)(local_b50.hit + 0x20);
                            iVar62 = *(int *)(local_b50.hit + 0x24);
                            iVar63 = *(int *)(local_b50.hit + 0x28);
                            iVar64 = *(int *)(local_b50.hit + 0x2c);
                            iVar65 = *(int *)(local_b50.hit + 0x30);
                            iVar66 = *(int *)(local_b50.hit + 0x34);
                            iVar67 = *(int *)(local_b50.hit + 0x38);
                            iVar68 = *(int *)(local_b50.hit + 0x3c);
                            bVar80 = (byte)uVar86;
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar76 = (byte)(uVar86 >> 8);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x300) =
                                 (uint)(bVar80 & 1) * *(int *)local_b50.hit |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x300);
                            *(uint *)(local_b50.ray + 0x304) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x304);
                            *(uint *)(local_b50.ray + 0x308) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x308);
                            *(uint *)(local_b50.ray + 0x30c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x30c);
                            *(uint *)(local_b50.ray + 0x310) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x310);
                            *(uint *)(local_b50.ray + 0x314) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x314);
                            *(uint *)(local_b50.ray + 0x318) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x318);
                            *(uint *)(local_b50.ray + 0x31c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x31c);
                            *(uint *)(local_b50.ray + 800) =
                                 (uint)(bVar76 & 1) * iVar61 |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 800);
                            *(uint *)(local_b50.ray + 0x324) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x324);
                            *(uint *)(local_b50.ray + 0x328) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x328);
                            *(uint *)(local_b50.ray + 0x32c) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x32c);
                            *(uint *)(local_b50.ray + 0x330) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x330);
                            *(uint *)(local_b50.ray + 0x334) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x334);
                            *(uint *)(local_b50.ray + 0x338) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x338);
                            *(uint *)(local_b50.ray + 0x33c) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x33c);
                            iVar3 = *(int *)(local_b50.hit + 0x44);
                            iVar4 = *(int *)(local_b50.hit + 0x48);
                            iVar1 = *(int *)(local_b50.hit + 0x4c);
                            iVar57 = *(int *)(local_b50.hit + 0x50);
                            iVar58 = *(int *)(local_b50.hit + 0x54);
                            iVar59 = *(int *)(local_b50.hit + 0x58);
                            iVar60 = *(int *)(local_b50.hit + 0x5c);
                            iVar61 = *(int *)(local_b50.hit + 0x60);
                            iVar62 = *(int *)(local_b50.hit + 100);
                            iVar63 = *(int *)(local_b50.hit + 0x68);
                            iVar64 = *(int *)(local_b50.hit + 0x6c);
                            iVar65 = *(int *)(local_b50.hit + 0x70);
                            iVar66 = *(int *)(local_b50.hit + 0x74);
                            iVar67 = *(int *)(local_b50.hit + 0x78);
                            iVar68 = *(int *)(local_b50.hit + 0x7c);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x340) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0x40) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x340);
                            *(uint *)(local_b50.ray + 0x344) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x344);
                            *(uint *)(local_b50.ray + 0x348) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x348);
                            *(uint *)(local_b50.ray + 0x34c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x34c);
                            *(uint *)(local_b50.ray + 0x350) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x350);
                            *(uint *)(local_b50.ray + 0x354) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x354);
                            *(uint *)(local_b50.ray + 0x358) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x358);
                            *(uint *)(local_b50.ray + 0x35c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x35c);
                            *(uint *)(local_b50.ray + 0x360) =
                                 (uint)(bVar76 & 1) * iVar61 |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x360);
                            *(uint *)(local_b50.ray + 0x364) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x364);
                            *(uint *)(local_b50.ray + 0x368) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x368);
                            *(uint *)(local_b50.ray + 0x36c) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x36c);
                            *(uint *)(local_b50.ray + 0x370) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x370);
                            *(uint *)(local_b50.ray + 0x374) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x374);
                            *(uint *)(local_b50.ray + 0x378) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x378);
                            *(uint *)(local_b50.ray + 0x37c) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x37c);
                            iVar3 = *(int *)(local_b50.hit + 0x84);
                            iVar4 = *(int *)(local_b50.hit + 0x88);
                            iVar1 = *(int *)(local_b50.hit + 0x8c);
                            iVar57 = *(int *)(local_b50.hit + 0x90);
                            iVar58 = *(int *)(local_b50.hit + 0x94);
                            iVar59 = *(int *)(local_b50.hit + 0x98);
                            iVar60 = *(int *)(local_b50.hit + 0x9c);
                            iVar61 = *(int *)(local_b50.hit + 0xa0);
                            iVar62 = *(int *)(local_b50.hit + 0xa4);
                            iVar63 = *(int *)(local_b50.hit + 0xa8);
                            iVar64 = *(int *)(local_b50.hit + 0xac);
                            iVar65 = *(int *)(local_b50.hit + 0xb0);
                            iVar66 = *(int *)(local_b50.hit + 0xb4);
                            iVar67 = *(int *)(local_b50.hit + 0xb8);
                            iVar68 = *(int *)(local_b50.hit + 0xbc);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x380) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0x80) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x380);
                            *(uint *)(local_b50.ray + 900) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 900);
                            *(uint *)(local_b50.ray + 0x388) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x388);
                            *(uint *)(local_b50.ray + 0x38c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x38c);
                            *(uint *)(local_b50.ray + 0x390) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x390);
                            *(uint *)(local_b50.ray + 0x394) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x394);
                            *(uint *)(local_b50.ray + 0x398) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x398);
                            *(uint *)(local_b50.ray + 0x39c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x39c);
                            *(uint *)(local_b50.ray + 0x3a0) =
                                 (uint)(bVar76 & 1) * iVar61 |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x3a0);
                            *(uint *)(local_b50.ray + 0x3a4) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x3a4);
                            *(uint *)(local_b50.ray + 0x3a8) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x3a8);
                            *(uint *)(local_b50.ray + 0x3ac) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ac);
                            *(uint *)(local_b50.ray + 0x3b0) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x3b0);
                            *(uint *)(local_b50.ray + 0x3b4) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x3b4);
                            *(uint *)(local_b50.ray + 0x3b8) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x3b8);
                            *(uint *)(local_b50.ray + 0x3bc) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x3bc);
                            iVar3 = *(int *)(local_b50.hit + 0xc4);
                            iVar4 = *(int *)(local_b50.hit + 200);
                            iVar1 = *(int *)(local_b50.hit + 0xcc);
                            iVar57 = *(int *)(local_b50.hit + 0xd0);
                            iVar58 = *(int *)(local_b50.hit + 0xd4);
                            iVar59 = *(int *)(local_b50.hit + 0xd8);
                            iVar60 = *(int *)(local_b50.hit + 0xdc);
                            iVar61 = *(int *)(local_b50.hit + 0xe0);
                            iVar62 = *(int *)(local_b50.hit + 0xe4);
                            iVar63 = *(int *)(local_b50.hit + 0xe8);
                            iVar64 = *(int *)(local_b50.hit + 0xec);
                            iVar65 = *(int *)(local_b50.hit + 0xf0);
                            iVar66 = *(int *)(local_b50.hit + 0xf4);
                            iVar67 = *(int *)(local_b50.hit + 0xf8);
                            iVar68 = *(int *)(local_b50.hit + 0xfc);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x3c0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0xc0) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x3c0);
                            *(uint *)(local_b50.ray + 0x3c4) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x3c4);
                            *(uint *)(local_b50.ray + 0x3c8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x3c8);
                            *(uint *)(local_b50.ray + 0x3cc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x3cc);
                            *(uint *)(local_b50.ray + 0x3d0) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x3d0);
                            *(uint *)(local_b50.ray + 0x3d4) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x3d4);
                            *(uint *)(local_b50.ray + 0x3d8) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x3d8);
                            *(uint *)(local_b50.ray + 0x3dc) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x3dc);
                            *(uint *)(local_b50.ray + 0x3e0) =
                                 (uint)(bVar76 & 1) * iVar61 |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x3e0);
                            *(uint *)(local_b50.ray + 0x3e4) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x3e4);
                            *(uint *)(local_b50.ray + 1000) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 1000);
                            *(uint *)(local_b50.ray + 0x3ec) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ec);
                            *(uint *)(local_b50.ray + 0x3f0) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x3f0);
                            *(uint *)(local_b50.ray + 0x3f4) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x3f4);
                            *(uint *)(local_b50.ray + 0x3f8) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x3f8);
                            *(uint *)(local_b50.ray + 0x3fc) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x3fc);
                            iVar3 = *(int *)(local_b50.hit + 0x104);
                            iVar4 = *(int *)(local_b50.hit + 0x108);
                            iVar1 = *(int *)(local_b50.hit + 0x10c);
                            iVar57 = *(int *)(local_b50.hit + 0x110);
                            iVar58 = *(int *)(local_b50.hit + 0x114);
                            iVar59 = *(int *)(local_b50.hit + 0x118);
                            iVar60 = *(int *)(local_b50.hit + 0x11c);
                            iVar61 = *(int *)(local_b50.hit + 0x120);
                            iVar62 = *(int *)(local_b50.hit + 0x124);
                            iVar63 = *(int *)(local_b50.hit + 0x128);
                            iVar64 = *(int *)(local_b50.hit + 300);
                            iVar65 = *(int *)(local_b50.hit + 0x130);
                            iVar66 = *(int *)(local_b50.hit + 0x134);
                            iVar67 = *(int *)(local_b50.hit + 0x138);
                            iVar68 = *(int *)(local_b50.hit + 0x13c);
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar86 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar86 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar86 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                            bVar17 = (bool)((byte)(uVar86 >> 7) & 1);
                            bVar18 = (bool)((byte)(uVar86 >> 9) & 1);
                            bVar19 = (bool)((byte)(uVar86 >> 10) & 1);
                            bVar20 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            bVar21 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            bVar22 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            bVar23 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            bVar24 = SUB81(uVar86 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x400) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0x100) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x400);
                            *(uint *)(local_b50.ray + 0x404) =
                                 (uint)bVar85 * iVar3 |
                                 (uint)!bVar85 * *(int *)(local_b50.ray + 0x404);
                            *(uint *)(local_b50.ray + 0x408) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_b50.ray + 0x408);
                            *(uint *)(local_b50.ray + 0x40c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_b50.ray + 0x40c);
                            *(uint *)(local_b50.ray + 0x410) =
                                 (uint)bVar14 * iVar57 |
                                 (uint)!bVar14 * *(int *)(local_b50.ray + 0x410);
                            *(uint *)(local_b50.ray + 0x414) =
                                 (uint)bVar15 * iVar58 |
                                 (uint)!bVar15 * *(int *)(local_b50.ray + 0x414);
                            *(uint *)(local_b50.ray + 0x418) =
                                 (uint)bVar16 * iVar59 |
                                 (uint)!bVar16 * *(int *)(local_b50.ray + 0x418);
                            *(uint *)(local_b50.ray + 0x41c) =
                                 (uint)bVar17 * iVar60 |
                                 (uint)!bVar17 * *(int *)(local_b50.ray + 0x41c);
                            *(uint *)(local_b50.ray + 0x420) =
                                 (uint)(bVar76 & 1) * iVar61 |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x420);
                            *(uint *)(local_b50.ray + 0x424) =
                                 (uint)bVar18 * iVar62 |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x424);
                            *(uint *)(local_b50.ray + 0x428) =
                                 (uint)bVar19 * iVar63 |
                                 (uint)!bVar19 * *(int *)(local_b50.ray + 0x428);
                            *(uint *)(local_b50.ray + 0x42c) =
                                 (uint)bVar20 * iVar64 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x42c);
                            *(uint *)(local_b50.ray + 0x430) =
                                 (uint)bVar21 * iVar65 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x430);
                            *(uint *)(local_b50.ray + 0x434) =
                                 (uint)bVar22 * iVar66 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x434);
                            *(uint *)(local_b50.ray + 0x438) =
                                 (uint)bVar23 * iVar67 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x438);
                            *(uint *)(local_b50.ray + 0x43c) =
                                 (uint)bVar24 * iVar68 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x43c);
                            auVar272 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x140));
                            auVar272 = vmovdqu32_avx512f(auVar272);
                            *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar272;
                            auVar272 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x180));
                            auVar272 = vmovdqu32_avx512f(auVar272);
                            *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar272;
                            auVar287 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x1c0));
                            auVar272 = vmovdqa32_avx512f(auVar287);
                            *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar272;
                            auVar272 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x200));
                            bVar85 = (bool)((byte)(uVar86 >> 1) & 1);
                            auVar53._4_56_ = auVar272._8_56_;
                            auVar53._0_4_ =
                                 (uint)bVar85 * auVar272._4_4_ | (uint)!bVar85 * auVar287._4_4_;
                            auVar150._0_8_ = auVar53._0_8_ << 0x20;
                            bVar85 = (bool)((byte)(uVar86 >> 2) & 1);
                            auVar150._8_4_ =
                                 (uint)bVar85 * auVar272._8_4_ | (uint)!bVar85 * auVar287._8_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 3) & 1);
                            auVar150._12_4_ =
                                 (uint)bVar85 * auVar272._12_4_ | (uint)!bVar85 * auVar287._12_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 4) & 1);
                            auVar150._16_4_ =
                                 (uint)bVar85 * auVar272._16_4_ | (uint)!bVar85 * auVar287._16_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 5) & 1);
                            auVar150._20_4_ =
                                 (uint)bVar85 * auVar272._20_4_ | (uint)!bVar85 * auVar287._20_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 6) & 1);
                            auVar150._24_4_ =
                                 (uint)bVar85 * auVar272._24_4_ | (uint)!bVar85 * auVar287._24_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 7) & 1);
                            auVar150._28_4_ =
                                 (uint)bVar85 * auVar272._28_4_ | (uint)!bVar85 * auVar287._28_4_;
                            auVar150._32_4_ =
                                 (uint)(bVar76 & 1) * auVar272._32_4_ |
                                 (uint)!(bool)(bVar76 & 1) * auVar287._32_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 9) & 1);
                            auVar150._36_4_ =
                                 (uint)bVar85 * auVar272._36_4_ | (uint)!bVar85 * auVar287._36_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 10) & 1);
                            auVar150._40_4_ =
                                 (uint)bVar85 * auVar272._40_4_ | (uint)!bVar85 * auVar287._40_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xb) & 1);
                            auVar150._44_4_ =
                                 (uint)bVar85 * auVar272._44_4_ | (uint)!bVar85 * auVar287._44_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xc) & 1);
                            auVar150._48_4_ =
                                 (uint)bVar85 * auVar272._48_4_ | (uint)!bVar85 * auVar287._48_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xd) & 1);
                            auVar150._52_4_ =
                                 (uint)bVar85 * auVar272._52_4_ | (uint)!bVar85 * auVar287._52_4_;
                            bVar85 = (bool)((byte)(uVar86 >> 0xe) & 1);
                            auVar150._56_4_ =
                                 (uint)bVar85 * auVar272._56_4_ | (uint)!bVar85 * auVar287._56_4_;
                            bVar85 = SUB81(uVar86 >> 0xf,0);
                            auVar150._60_4_ =
                                 (uint)bVar85 * auVar272._60_4_ | (uint)!bVar85 * auVar287._60_4_;
                            auVar272 = vmovdqa32_avx512f(auVar272);
                            *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar272;
                            goto LAB_01b5a6ed;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar250;
                      }
                    }
                  }
                }
LAB_01b5a6ed:
                auVar102 = auVar150._32_32_;
                bVar85 = lVar84 != 0;
                lVar84 = lVar84 + -1;
              } while ((!bVar11) && (bVar85));
              auVar70._4_4_ = fStack_85c;
              auVar70._0_4_ = local_860;
              auVar70._8_4_ = fStack_858;
              auVar70._12_4_ = fStack_854;
              auVar70._16_4_ = fStack_850;
              auVar70._20_4_ = fStack_84c;
              auVar70._24_4_ = fStack_848;
              auVar70._28_4_ = fStack_844;
              uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar43._4_4_ = uVar5;
              auVar43._0_4_ = uVar5;
              auVar43._8_4_ = uVar5;
              auVar43._12_4_ = uVar5;
              auVar43._16_4_ = uVar5;
              auVar43._20_4_ = uVar5;
              auVar43._24_4_ = uVar5;
              auVar43._28_4_ = uVar5;
              uVar25 = vcmpps_avx512vl(auVar70,auVar43,2);
              bVar81 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar81 & (byte)uVar25;
            } while (bVar81 != 0);
          }
          uVar26 = vpcmpd_avx512vl(local_7e0,_local_880,1);
          uVar27 = vpcmpd_avx512vl(local_7e0,local_740,1);
          auVar194._0_4_ = (float)local_940._0_4_ + (float)local_500._0_4_;
          auVar194._4_4_ = (float)local_940._4_4_ + (float)local_500._4_4_;
          auVar194._8_4_ = fStack_938 + fStack_4f8;
          auVar194._12_4_ = fStack_934 + fStack_4f4;
          auVar194._16_4_ = fStack_930 + fStack_4f0;
          auVar194._20_4_ = fStack_92c + fStack_4ec;
          auVar194._24_4_ = fStack_928 + fStack_4e8;
          auVar194._28_4_ = fStack_924 + fStack_4e4;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar211._4_4_ = uVar5;
          auVar211._0_4_ = uVar5;
          auVar211._8_4_ = uVar5;
          auVar211._12_4_ = uVar5;
          auVar211._16_4_ = uVar5;
          auVar211._20_4_ = uVar5;
          auVar211._24_4_ = uVar5;
          auVar211._28_4_ = uVar5;
          uVar25 = vcmpps_avx512vl(auVar194,auVar211,2);
          bVar78 = bVar78 & (byte)uVar27 & (byte)uVar25;
          auVar224._0_4_ = (float)local_940._0_4_ + (float)local_780._0_4_;
          auVar224._4_4_ = (float)local_940._4_4_ + (float)local_780._4_4_;
          auVar224._8_4_ = fStack_938 + fStack_778;
          auVar224._12_4_ = fStack_934 + fStack_774;
          auVar224._16_4_ = fStack_930 + fStack_770;
          auVar224._20_4_ = fStack_92c + fStack_76c;
          auVar224._24_4_ = fStack_928 + fStack_768;
          auVar224._28_4_ = fStack_924 + fStack_764;
          uVar25 = vcmpps_avx512vl(auVar224,auVar211,2);
          bVar74 = bVar74 & (byte)uVar26 & (byte)uVar25 | bVar78;
          prim = local_ac0;
          if (bVar74 != 0) {
            uVar86 = local_ab0 & 0xffffffff;
            abStack_1a0[uVar86 * 0x60] = bVar74;
            bVar11 = (bool)(bVar78 >> 1 & 1);
            bVar85 = (bool)(bVar78 >> 2 & 1);
            bVar12 = (bool)(bVar78 >> 3 & 1);
            bVar13 = (bool)(bVar78 >> 4 & 1);
            bVar14 = (bool)(bVar78 >> 5 & 1);
            auStack_180[uVar86 * 0x18] =
                 (uint)(bVar78 & 1) * local_500._0_4_ | (uint)!(bool)(bVar78 & 1) * local_780._0_4_;
            auStack_180[uVar86 * 0x18 + 1] =
                 (uint)bVar11 * local_500._4_4_ | (uint)!bVar11 * local_780._4_4_;
            auStack_180[uVar86 * 0x18 + 2] =
                 (uint)bVar85 * (int)fStack_4f8 | (uint)!bVar85 * (int)fStack_778;
            auStack_180[uVar86 * 0x18 + 3] =
                 (uint)bVar12 * (int)fStack_4f4 | (uint)!bVar12 * (int)fStack_774;
            auStack_180[uVar86 * 0x18 + 4] =
                 (uint)bVar13 * (int)fStack_4f0 | (uint)!bVar13 * (int)fStack_770;
            auStack_180[uVar86 * 0x18 + 5] =
                 (uint)bVar14 * (int)fStack_4ec | (uint)!bVar14 * (int)fStack_76c;
            auStack_180[uVar86 * 0x18 + 6] =
                 (uint)(bVar78 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar78 >> 6) * (int)fStack_768;
            (&fStack_164)[uVar86 * 0x18] = fStack_764;
            uVar25 = vmovlps_avx(auVar200);
            (&uStack_160)[uVar86 * 0xc] = uVar25;
            afStack_158[uVar86 * 0x18] = (float)((int)local_ab8 + 1);
            local_ab0 = (ulong)((int)local_ab0 + 1);
            auVar177 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar272 = ZEXT3264(_DAT_02020f20);
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar287 = ZEXT3264(auVar104);
            goto LAB_01b5ab35;
          }
          auVar249._8_4_ = 0x7fffffff;
          auVar249._0_8_ = 0x7fffffff7fffffff;
          auVar249._12_4_ = 0x7fffffff;
          auVar249._16_4_ = 0x7fffffff;
          auVar249._20_4_ = 0x7fffffff;
          auVar249._24_4_ = 0x7fffffff;
          auVar249._28_4_ = 0x7fffffff;
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        auVar272 = ZEXT3264(_DAT_02020f20);
        auVar287 = ZEXT3264(auVar104);
        auVar177 = ZEXT3264(auVar249);
      }
    }
LAB_01b5ab35:
    auVar212 = ZEXT1664(auVar200);
    local_ab0 = local_ab0 & 0xffffffff;
    do {
      if ((int)local_ab0 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar33._4_4_ = uVar5;
        auVar33._0_4_ = uVar5;
        auVar33._8_4_ = uVar5;
        auVar33._12_4_ = uVar5;
        uVar25 = vcmpps_avx512vl(local_7f0,auVar33,2);
        uVar83 = (uint)local_aa8 & (uint)uVar25;
        local_aa8 = (ulong)uVar83;
        if (uVar83 == 0) {
          return;
        }
        goto LAB_01b5822f;
      }
      uVar86 = (ulong)((int)local_ab0 - 1);
      auVar104 = *(undefined1 (*) [32])(auStack_180 + uVar86 * 0x18);
      auVar195._0_4_ = auVar104._0_4_ + (float)local_940._0_4_;
      auVar195._4_4_ = auVar104._4_4_ + (float)local_940._4_4_;
      auVar195._8_4_ = auVar104._8_4_ + fStack_938;
      auVar195._12_4_ = auVar104._12_4_ + fStack_934;
      auVar195._16_4_ = auVar104._16_4_ + fStack_930;
      auVar195._20_4_ = auVar104._20_4_ + fStack_92c;
      auVar195._24_4_ = auVar104._24_4_ + fStack_928;
      auVar195._28_4_ = auVar104._28_4_ + fStack_924;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar44._4_4_ = uVar5;
      auVar44._0_4_ = uVar5;
      auVar44._8_4_ = uVar5;
      auVar44._12_4_ = uVar5;
      auVar44._16_4_ = uVar5;
      auVar44._20_4_ = uVar5;
      auVar44._24_4_ = uVar5;
      auVar44._28_4_ = uVar5;
      uVar25 = vcmpps_avx512vl(auVar195,auVar44,2);
      uVar79 = (uint)uVar25 & (uint)abStack_1a0[uVar86 * 0x60];
      bVar74 = (byte)uVar79;
      if (uVar79 != 0) {
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar103 = vblendmps_avx512vl(auVar196,auVar104);
        auVar142._0_4_ =
             (uint)(bVar74 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar104._0_4_;
        bVar11 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar142._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * (int)auVar104._4_4_;
        bVar11 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar142._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * (int)auVar104._8_4_;
        bVar11 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar142._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * (int)auVar104._12_4_;
        bVar11 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar142._16_4_ = (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * (int)auVar104._16_4_;
        bVar11 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar142._20_4_ = (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * (int)auVar104._20_4_;
        bVar11 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar142._24_4_ = (uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * (int)auVar104._24_4_;
        auVar142._28_4_ =
             (uVar79 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar79 >> 7,0) * (int)auVar104._28_4_;
        auVar104 = vshufps_avx(auVar142,auVar142,0xb1);
        auVar104 = vminps_avx(auVar142,auVar104);
        auVar103 = vshufpd_avx(auVar104,auVar104,5);
        auVar104 = vminps_avx(auVar104,auVar103);
        auVar103 = vpermpd_avx2(auVar104,0x4e);
        auVar104 = vminps_avx(auVar104,auVar103);
        uVar25 = vcmpps_avx512vl(auVar142,auVar104,0);
        bVar81 = (byte)uVar25 & bVar74;
        if (bVar81 != 0) {
          uVar79 = (uint)bVar81;
        }
        fVar261 = afStack_158[uVar86 * 0x18 + -1];
        uVar151 = 0;
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
          uVar151 = uVar151 + 1;
        }
        local_ab8 = (ulong)(uint)afStack_158[uVar86 * 0x18];
        bVar81 = ~('\x01' << ((byte)uVar151 & 0x1f)) & bVar74;
        abStack_1a0[uVar86 * 0x60] = bVar81;
        uVar77 = uVar86;
        if (bVar81 != 0) {
          uVar77 = local_ab0;
        }
        fVar264 = *(float *)(&uStack_160 + uVar86 * 0xc);
        auVar197._4_4_ = fVar264;
        auVar197._0_4_ = fVar264;
        auVar197._8_4_ = fVar264;
        auVar197._12_4_ = fVar264;
        auVar197._16_4_ = fVar264;
        auVar197._20_4_ = fVar264;
        auVar197._24_4_ = fVar264;
        auVar197._28_4_ = fVar264;
        fVar261 = fVar261 - fVar264;
        auVar176._4_4_ = fVar261;
        auVar176._0_4_ = fVar261;
        auVar176._8_4_ = fVar261;
        auVar176._12_4_ = fVar261;
        auVar176._16_4_ = fVar261;
        auVar176._20_4_ = fVar261;
        auVar176._24_4_ = fVar261;
        auVar176._28_4_ = fVar261;
        auVar91 = vfmadd132ps_fma(auVar176,auVar197,auVar272._0_32_);
        auVar104 = ZEXT1632(auVar91);
        local_400[0] = (RTCHitN)auVar104[0];
        local_400[1] = (RTCHitN)auVar104[1];
        local_400[2] = (RTCHitN)auVar104[2];
        local_400[3] = (RTCHitN)auVar104[3];
        local_400[4] = (RTCHitN)auVar104[4];
        local_400[5] = (RTCHitN)auVar104[5];
        local_400[6] = (RTCHitN)auVar104[6];
        local_400[7] = (RTCHitN)auVar104[7];
        local_400[8] = (RTCHitN)auVar104[8];
        local_400[9] = (RTCHitN)auVar104[9];
        local_400[10] = (RTCHitN)auVar104[10];
        local_400[0xb] = (RTCHitN)auVar104[0xb];
        local_400[0xc] = (RTCHitN)auVar104[0xc];
        local_400[0xd] = (RTCHitN)auVar104[0xd];
        local_400[0xe] = (RTCHitN)auVar104[0xe];
        local_400[0xf] = (RTCHitN)auVar104[0xf];
        local_400[0x10] = (RTCHitN)auVar104[0x10];
        local_400[0x11] = (RTCHitN)auVar104[0x11];
        local_400[0x12] = (RTCHitN)auVar104[0x12];
        local_400[0x13] = (RTCHitN)auVar104[0x13];
        local_400[0x14] = (RTCHitN)auVar104[0x14];
        local_400[0x15] = (RTCHitN)auVar104[0x15];
        local_400[0x16] = (RTCHitN)auVar104[0x16];
        local_400[0x17] = (RTCHitN)auVar104[0x17];
        local_400[0x18] = (RTCHitN)auVar104[0x18];
        local_400[0x19] = (RTCHitN)auVar104[0x19];
        local_400[0x1a] = (RTCHitN)auVar104[0x1a];
        local_400[0x1b] = (RTCHitN)auVar104[0x1b];
        local_400[0x1c] = (RTCHitN)auVar104[0x1c];
        local_400[0x1d] = (RTCHitN)auVar104[0x1d];
        local_400[0x1e] = (RTCHitN)auVar104[0x1e];
        local_400[0x1f] = (RTCHitN)auVar104[0x1f];
        auVar212 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar151 * 4));
        uVar86 = uVar77;
      }
      local_ab0 = uVar86;
    } while (bVar74 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }